

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  byte bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  AABBNodeMB4D *node1;
  ulong uVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  ulong uVar63;
  uint uVar64;
  long lVar65;
  Geometry *pGVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  bool bVar72;
  float fVar73;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar74;
  float fVar86;
  float fVar88;
  float fVar91;
  undefined1 auVar79 [16];
  float fVar85;
  float fVar87;
  float fVar92;
  float fVar95;
  float fVar98;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar89;
  float fVar90;
  float fVar93;
  float fVar96;
  float fVar99;
  undefined1 auVar83 [32];
  float fVar94;
  float fVar97;
  float fVar100;
  undefined1 auVar84 [32];
  float fVar101;
  float fVar112;
  float fVar113;
  vint4 ai_5;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar114;
  float fVar115;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  vint4 ai;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  vint4 bi;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar154;
  vint4 ai_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar155;
  undefined1 auVar151 [16];
  float fVar156;
  float fVar158;
  float fVar160;
  undefined1 auVar152 [32];
  float fVar157;
  float fVar159;
  float fVar161;
  float fVar162;
  undefined1 auVar153 [32];
  vint4 bi_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar187;
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  float fVar185;
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar184 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  float fVar203;
  float fVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  float fVar214;
  undefined1 auVar210 [32];
  float fVar212;
  float fVar213;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [64];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  float fVar220;
  undefined1 auVar221 [32];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar222 [64];
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar232 [32];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar233 [64];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar255 [64];
  float fVar262;
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar264 [64];
  float old_t;
  vint4 bi_5;
  vint4 bi_2;
  RTCFilterFunctionNArguments args;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack [244];
  undefined1 local_e81;
  size_t local_e80;
  RayK<8> *local_e78;
  uint local_e70;
  uint local_e6c;
  ulong local_e68;
  undefined8 local_e60;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  ulong local_e40;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  undefined1 local_e20 [16];
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined1 local_e00 [32];
  undefined1 *local_dc8;
  undefined1 (*local_dc0) [16];
  ulong local_db8;
  ulong local_db0;
  long local_da8;
  long local_da0;
  long local_d98;
  ulong *local_d90;
  ulong local_d88;
  long local_d80;
  long local_d78;
  Scene *local_d70;
  ulong local_d68;
  Geometry *local_d60;
  undefined1 auStack_d58 [24];
  undefined1 local_d40 [32];
  undefined1 local_d20 [16];
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  RTCFilterFunctionNArguments local_c30;
  undefined1 local_c00 [32];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 *local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  float local_980 [4];
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  float local_940 [4];
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined4 uStack_924;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_d90 = local_7f8;
  local_800 = root.ptr;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_bb0._4_4_ = uVar3;
  local_bb0._0_4_ = uVar3;
  local_bb0._8_4_ = uVar3;
  local_bb0._12_4_ = uVar3;
  auVar233 = ZEXT1664(local_bb0);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_bc0._4_4_ = uVar3;
  local_bc0._0_4_ = uVar3;
  local_bc0._8_4_ = uVar3;
  local_bc0._12_4_ = uVar3;
  auVar253 = ZEXT1664(local_bc0);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_bd0._4_4_ = uVar3;
  local_bd0._0_4_ = uVar3;
  local_bd0._8_4_ = uVar3;
  local_bd0._12_4_ = uVar3;
  auVar255 = ZEXT1664(local_bd0);
  fVar73 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar76 = ZEXT416((uint)(fVar73 * 0.99999964));
  local_be0 = vshufps_avx(auVar76,auVar76,0);
  auVar264 = ZEXT1664(local_be0);
  auVar76 = ZEXT416((uint)(fVar86 * 0.99999964));
  local_c40 = vshufps_avx(auVar76,auVar76,0);
  auVar202 = ZEXT1664(local_c40);
  auVar76 = ZEXT416((uint)(fVar88 * 0.99999964));
  local_c50 = vshufps_avx(auVar76,auVar76,0);
  auVar184 = ZEXT1664(local_c50);
  auVar76 = ZEXT416((uint)(fVar73 * 1.0000004));
  local_c60 = vshufps_avx(auVar76,auVar76,0);
  auVar211 = ZEXT1664(local_c60);
  auVar76 = ZEXT416((uint)(fVar86 * 1.0000004));
  local_c70 = vshufps_avx(auVar76,auVar76,0);
  auVar219 = ZEXT1664(local_c70);
  auVar76 = ZEXT416((uint)(fVar88 * 1.0000004));
  local_c80 = vshufps_avx(auVar76,auVar76,0);
  auVar197 = ZEXT1664(local_c80);
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_d68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar69 = uVar68 ^ 0x10;
  uVar71 = local_d68 ^ 0x10;
  iVar4 = (tray->tnear).field_0.i[k];
  local_c90._4_4_ = iVar4;
  local_c90._0_4_ = iVar4;
  local_c90._8_4_ = iVar4;
  local_c90._12_4_ = iVar4;
  auVar172 = ZEXT1664(local_c90);
  local_b40._16_16_ = mm_lookupmask_ps._240_16_;
  local_b40._0_16_ = mm_lookupmask_ps._0_16_;
  uVar64 = 1 << ((byte)k & 0x1f);
  iVar4 = (tray->tfar).field_0.i[k];
  local_ca0._4_4_ = iVar4;
  local_ca0._0_4_ = iVar4;
  local_ca0._8_4_ = iVar4;
  local_ca0._12_4_ = iVar4;
  auVar222 = ZEXT1664(local_ca0);
  local_dc0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar64 & 0xf) << 4));
  local_dc8 = mm_lookupmask_ps + (long)((int)uVar64 >> 4) * 0x10;
  auVar125._8_4_ = 0x3f800000;
  auVar125._0_8_ = 0x3f8000003f800000;
  auVar125._12_4_ = 0x3f800000;
  auVar125._16_4_ = 0x3f800000;
  auVar125._20_4_ = 0x3f800000;
  auVar125._24_4_ = 0x3f800000;
  auVar125._28_4_ = 0x3f800000;
  auVar80._8_4_ = 0xbf800000;
  auVar80._0_8_ = 0xbf800000bf800000;
  auVar80._12_4_ = 0xbf800000;
  auVar80._16_4_ = 0xbf800000;
  auVar80._20_4_ = 0xbf800000;
  auVar80._24_4_ = 0xbf800000;
  auVar80._28_4_ = 0xbf800000;
  _local_b60 = vblendvps_avx(auVar125,auVar80,local_b40);
  bVar72 = true;
  local_e80 = k;
  local_e78 = ray;
  local_db0 = uVar68;
  do {
    uVar70 = local_d90[-1];
    local_d90 = local_d90 + -1;
    while ((uVar70 & 8) == 0) {
      uVar58 = uVar70 & 0xfffffffffffffff0;
      fVar73 = *(float *)(ray + k * 4 + 0xe0);
      auVar75._4_4_ = fVar73;
      auVar75._0_4_ = fVar73;
      auVar75._8_4_ = fVar73;
      auVar75._12_4_ = fVar73;
      pfVar2 = (float *)(uVar58 + 0x80 + uVar68);
      pfVar1 = (float *)(uVar58 + 0x20 + uVar68);
      auVar76._0_4_ = fVar73 * *pfVar2 + *pfVar1;
      auVar76._4_4_ = fVar73 * pfVar2[1] + pfVar1[1];
      auVar76._8_4_ = fVar73 * pfVar2[2] + pfVar1[2];
      auVar76._12_4_ = fVar73 * pfVar2[3] + pfVar1[3];
      auVar76 = vsubps_avx(auVar76,auVar233._0_16_);
      auVar102._0_4_ = auVar264._0_4_ * auVar76._0_4_;
      auVar102._4_4_ = auVar264._4_4_ * auVar76._4_4_;
      auVar102._8_4_ = auVar264._8_4_ * auVar76._8_4_;
      auVar102._12_4_ = auVar264._12_4_ * auVar76._12_4_;
      pfVar2 = (float *)(uVar58 + 0x80 + local_d68);
      pfVar1 = (float *)(uVar58 + 0x20 + local_d68);
      auVar116._0_4_ = fVar73 * *pfVar2 + *pfVar1;
      auVar116._4_4_ = fVar73 * pfVar2[1] + pfVar1[1];
      auVar116._8_4_ = fVar73 * pfVar2[2] + pfVar1[2];
      auVar116._12_4_ = fVar73 * pfVar2[3] + pfVar1[3];
      auVar76 = vsubps_avx(auVar116,auVar253._0_16_);
      auVar117._0_4_ = auVar202._0_4_ * auVar76._0_4_;
      auVar117._4_4_ = auVar202._4_4_ * auVar76._4_4_;
      auVar117._8_4_ = auVar202._8_4_ * auVar76._8_4_;
      auVar117._12_4_ = auVar202._12_4_ * auVar76._12_4_;
      pfVar2 = (float *)(uVar58 + 0x80 + uVar63);
      pfVar1 = (float *)(uVar58 + 0x20 + uVar63);
      auVar132._0_4_ = fVar73 * *pfVar2 + *pfVar1;
      auVar132._4_4_ = fVar73 * pfVar2[1] + pfVar1[1];
      auVar132._8_4_ = fVar73 * pfVar2[2] + pfVar1[2];
      auVar132._12_4_ = fVar73 * pfVar2[3] + pfVar1[3];
      auVar76 = vsubps_avx(auVar132,auVar255._0_16_);
      auVar133._0_4_ = auVar184._0_4_ * auVar76._0_4_;
      auVar133._4_4_ = auVar184._4_4_ * auVar76._4_4_;
      auVar133._8_4_ = auVar184._8_4_ * auVar76._8_4_;
      auVar133._12_4_ = auVar184._12_4_ * auVar76._12_4_;
      auVar76 = vmaxps_avx(auVar117,auVar133);
      auVar102 = vmaxps_avx(auVar172._0_16_,auVar102);
      pfVar2 = (float *)(uVar58 + 0x80 + uVar69);
      pfVar1 = (float *)(uVar58 + 0x20 + uVar69);
      auVar134._0_4_ = fVar73 * *pfVar2 + *pfVar1;
      auVar134._4_4_ = fVar73 * pfVar2[1] + pfVar1[1];
      auVar134._8_4_ = fVar73 * pfVar2[2] + pfVar1[2];
      auVar134._12_4_ = fVar73 * pfVar2[3] + pfVar1[3];
      auVar76 = vmaxps_avx(auVar102,auVar76);
      auVar102 = vsubps_avx(auVar134,auVar233._0_16_);
      pfVar2 = (float *)(uVar58 + 0x80 + uVar71);
      auVar118._0_4_ = auVar211._0_4_ * auVar102._0_4_;
      auVar118._4_4_ = auVar211._4_4_ * auVar102._4_4_;
      auVar118._8_4_ = auVar211._8_4_ * auVar102._8_4_;
      auVar118._12_4_ = auVar211._12_4_ * auVar102._12_4_;
      pfVar1 = (float *)(uVar58 + 0x20 + uVar71);
      auVar135._0_4_ = fVar73 * *pfVar2 + *pfVar1;
      auVar135._4_4_ = fVar73 * pfVar2[1] + pfVar1[1];
      auVar135._8_4_ = fVar73 * pfVar2[2] + pfVar1[2];
      auVar135._12_4_ = fVar73 * pfVar2[3] + pfVar1[3];
      auVar102 = vsubps_avx(auVar135,auVar253._0_16_);
      pfVar2 = (float *)(uVar58 + 0x80 + (uVar63 ^ 0x10));
      pfVar1 = (float *)(uVar58 + 0x20 + (uVar63 ^ 0x10));
      auVar142._0_4_ = fVar73 * *pfVar2 + *pfVar1;
      auVar142._4_4_ = fVar73 * pfVar2[1] + pfVar1[1];
      auVar142._8_4_ = fVar73 * pfVar2[2] + pfVar1[2];
      auVar142._12_4_ = fVar73 * pfVar2[3] + pfVar1[3];
      auVar136._0_4_ = auVar219._0_4_ * auVar102._0_4_;
      auVar136._4_4_ = auVar219._4_4_ * auVar102._4_4_;
      auVar136._8_4_ = auVar219._8_4_ * auVar102._8_4_;
      auVar136._12_4_ = auVar219._12_4_ * auVar102._12_4_;
      auVar102 = vsubps_avx(auVar142,auVar255._0_16_);
      auVar143._0_4_ = auVar197._0_4_ * auVar102._0_4_;
      auVar143._4_4_ = auVar197._4_4_ * auVar102._4_4_;
      auVar143._8_4_ = auVar197._8_4_ * auVar102._8_4_;
      auVar143._12_4_ = auVar197._12_4_ * auVar102._12_4_;
      auVar102 = vminps_avx(auVar136,auVar143);
      auVar116 = vminps_avx(auVar222._0_16_,auVar118);
      auVar102 = vminps_avx(auVar116,auVar102);
      if (((uint)uVar70 & 7) == 6) {
        auVar102 = vcmpps_avx(auVar76,auVar102,2);
        auVar76 = vcmpps_avx(*(undefined1 (*) [16])(uVar58 + 0xe0),auVar75,2);
        auVar116 = vcmpps_avx(auVar75,*(undefined1 (*) [16])(uVar58 + 0xf0),1);
        auVar76 = vandps_avx(auVar76,auVar116);
        auVar76 = vandps_avx(auVar76,auVar102);
      }
      else {
        auVar76 = vcmpps_avx(auVar76,auVar102,2);
      }
      auVar76 = vpslld_avx(auVar76,0x1f);
      uVar64 = vmovmskps_avx(auVar76);
      if (uVar64 == 0) goto LAB_003c7ba2;
      uVar64 = uVar64 & 0xff;
      lVar13 = 0;
      if (uVar64 != 0) {
        for (; (uVar64 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar70 = *(ulong *)(uVar58 + lVar13 * 8);
      uVar64 = uVar64 - 1 & uVar64;
      if (uVar64 != 0) {
        *local_d90 = uVar70;
        local_d90 = local_d90 + 1;
        lVar13 = 0;
        if (uVar64 != 0) {
          for (; (uVar64 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        uVar70 = *(ulong *)(uVar58 + lVar13 * 8);
        uVar64 = uVar64 - 1 & uVar64;
        uVar67 = (ulong)uVar64;
        if (uVar64 != 0) {
          do {
            *local_d90 = uVar70;
            local_d90 = local_d90 + 1;
            lVar13 = 0;
            if (uVar67 != 0) {
              for (; (uVar67 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            uVar70 = *(ulong *)(uVar58 + lVar13 * 8);
            uVar67 = uVar67 & uVar67 - 1;
          } while (uVar67 != 0);
        }
      }
    }
    local_d98 = (ulong)((uint)uVar70 & 0xf) - 8;
    if (local_d98 != 0) {
      uVar70 = uVar70 & 0xfffffffffffffff0;
      local_da0 = 0;
      do {
        local_da8 = local_da0 * 0x90;
        uVar58 = *(ulong *)(uVar70 + 0x20 + local_da8);
        auVar119._8_8_ = 0;
        auVar119._0_8_ = uVar58;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = *(ulong *)(uVar70 + 0x24 + local_da8);
        auVar76 = vpminub_avx(auVar119,auVar137);
        auVar102 = vpcmpeqb_avx(auVar119,auVar76);
        auVar120._8_8_ = 0;
        auVar120._0_8_ = uVar58;
        auVar76 = vpmovzxbd_avx(auVar120);
        auVar76 = vcvtdq2ps_avx(auVar76);
        fVar73 = *(float *)(uVar70 + 0x44 + local_da8);
        fVar86 = *(float *)(uVar70 + 0x38 + local_da8);
        auVar121._0_4_ = fVar73 * auVar76._0_4_ + fVar86;
        auVar121._4_4_ = fVar73 * auVar76._4_4_ + fVar86;
        auVar121._8_4_ = fVar73 * auVar76._8_4_ + fVar86;
        auVar121._12_4_ = fVar73 * auVar76._12_4_ + fVar86;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = *(ulong *)(uVar70 + 0x50 + local_da8);
        auVar76 = vpmovzxbd_avx(auVar174);
        auVar76 = vcvtdq2ps_avx(auVar76);
        fVar88 = *(float *)(uVar70 + 0x74 + local_da8);
        fVar91 = *(float *)(uVar70 + 0x68 + local_da8);
        auVar175._0_4_ = fVar91 + fVar88 * auVar76._0_4_;
        auVar175._4_4_ = fVar91 + fVar88 * auVar76._4_4_;
        auVar175._8_4_ = fVar91 + fVar88 * auVar76._8_4_;
        auVar175._12_4_ = fVar91 + fVar88 * auVar76._12_4_;
        auVar76 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                 *(float *)(uVar70 + 0x80 + local_da8)) *
                                *(float *)(uVar70 + 0x84 + local_da8)));
        auVar76 = vshufps_avx(auVar76,auVar76,0);
        auVar116 = vsubps_avx(auVar175,auVar121);
        fVar94 = auVar76._0_4_;
        fVar97 = auVar76._4_4_;
        fVar100 = auVar76._8_4_;
        fVar154 = auVar76._12_4_;
        auVar122._0_4_ = auVar121._0_4_ + fVar94 * auVar116._0_4_;
        auVar122._4_4_ = auVar121._4_4_ + fVar97 * auVar116._4_4_;
        auVar122._8_4_ = auVar121._8_4_ + fVar100 * auVar116._8_4_;
        auVar122._12_4_ = auVar121._12_4_ + fVar154 * auVar116._12_4_;
        auVar76 = vpmovzxbd_avx(auVar137);
        auVar76 = vcvtdq2ps_avx(auVar76);
        auVar138._0_4_ = fVar86 + fVar73 * auVar76._0_4_;
        auVar138._4_4_ = fVar86 + fVar73 * auVar76._4_4_;
        auVar138._8_4_ = fVar86 + fVar73 * auVar76._8_4_;
        auVar138._12_4_ = fVar86 + fVar73 * auVar76._12_4_;
        auVar144._8_8_ = 0;
        auVar144._0_8_ = *(ulong *)(uVar70 + 0x54 + local_da8);
        auVar76 = vpmovzxbd_avx(auVar144);
        auVar76 = vcvtdq2ps_avx(auVar76);
        auVar145._0_4_ = fVar91 + fVar88 * auVar76._0_4_;
        auVar145._4_4_ = fVar91 + fVar88 * auVar76._4_4_;
        auVar145._8_4_ = fVar91 + fVar88 * auVar76._8_4_;
        auVar145._12_4_ = fVar91 + fVar88 * auVar76._12_4_;
        auVar76 = vsubps_avx(auVar145,auVar138);
        auVar139._0_4_ = auVar138._0_4_ + fVar94 * auVar76._0_4_;
        auVar139._4_4_ = auVar138._4_4_ + fVar97 * auVar76._4_4_;
        auVar139._8_4_ = auVar138._8_4_ + fVar100 * auVar76._8_4_;
        auVar139._12_4_ = auVar138._12_4_ + fVar154 * auVar76._12_4_;
        auVar146._8_8_ = 0;
        auVar146._0_8_ = *(ulong *)(uVar70 + 0x28 + local_da8);
        auVar76 = vpmovzxbd_avx(auVar146);
        auVar76 = vcvtdq2ps_avx(auVar76);
        fVar73 = *(float *)(uVar70 + 0x48 + local_da8);
        fVar86 = *(float *)(uVar70 + 0x3c + local_da8);
        auVar147._0_4_ = fVar86 + fVar73 * auVar76._0_4_;
        auVar147._4_4_ = fVar86 + fVar73 * auVar76._4_4_;
        auVar147._8_4_ = fVar86 + fVar73 * auVar76._8_4_;
        auVar147._12_4_ = fVar86 + fVar73 * auVar76._12_4_;
        auVar191._8_8_ = 0;
        auVar191._0_8_ = *(ulong *)(uVar70 + 0x58 + local_da8);
        auVar76 = vpmovzxbd_avx(auVar191);
        auVar76 = vcvtdq2ps_avx(auVar76);
        fVar88 = *(float *)(uVar70 + 0x78 + local_da8);
        fVar91 = *(float *)(uVar70 + 0x6c + local_da8);
        auVar192._0_4_ = fVar91 + fVar88 * auVar76._0_4_;
        auVar192._4_4_ = fVar91 + fVar88 * auVar76._4_4_;
        auVar192._8_4_ = fVar91 + fVar88 * auVar76._8_4_;
        auVar192._12_4_ = fVar91 + fVar88 * auVar76._12_4_;
        auVar76 = vsubps_avx(auVar192,auVar147);
        auVar148._0_4_ = auVar147._0_4_ + fVar94 * auVar76._0_4_;
        auVar148._4_4_ = auVar147._4_4_ + fVar97 * auVar76._4_4_;
        auVar148._8_4_ = auVar147._8_4_ + fVar100 * auVar76._8_4_;
        auVar148._12_4_ = auVar147._12_4_ + fVar154 * auVar76._12_4_;
        auVar193._8_8_ = 0;
        auVar193._0_8_ = *(ulong *)(uVar70 + 0x2c + local_da8);
        auVar76 = vpmovzxbd_avx(auVar193);
        auVar76 = vcvtdq2ps_avx(auVar76);
        auVar163._0_4_ = fVar86 + fVar73 * auVar76._0_4_;
        auVar163._4_4_ = fVar86 + fVar73 * auVar76._4_4_;
        auVar163._8_4_ = fVar86 + fVar73 * auVar76._8_4_;
        auVar163._12_4_ = fVar86 + fVar73 * auVar76._12_4_;
        auVar176._8_8_ = 0;
        auVar176._0_8_ = *(ulong *)(uVar70 + 0x5c + local_da8);
        auVar76 = vpmovzxbd_avx(auVar176);
        auVar76 = vcvtdq2ps_avx(auVar76);
        auVar177._0_4_ = fVar91 + fVar88 * auVar76._0_4_;
        auVar177._4_4_ = fVar91 + fVar88 * auVar76._4_4_;
        auVar177._8_4_ = fVar91 + fVar88 * auVar76._8_4_;
        auVar177._12_4_ = fVar91 + fVar88 * auVar76._12_4_;
        auVar76 = vsubps_avx(auVar177,auVar163);
        auVar164._0_4_ = auVar163._0_4_ + fVar94 * auVar76._0_4_;
        auVar164._4_4_ = auVar163._4_4_ + fVar97 * auVar76._4_4_;
        auVar164._8_4_ = auVar163._8_4_ + fVar100 * auVar76._8_4_;
        auVar164._12_4_ = auVar163._12_4_ + fVar154 * auVar76._12_4_;
        auVar178._8_8_ = 0;
        auVar178._0_8_ = *(ulong *)(uVar70 + 0x30 + local_da8);
        auVar76 = vpmovzxbd_avx(auVar178);
        auVar76 = vcvtdq2ps_avx(auVar76);
        fVar73 = *(float *)(uVar70 + 0x4c + local_da8);
        fVar86 = *(float *)(uVar70 + 0x40 + local_da8);
        auVar179._0_4_ = fVar86 + fVar73 * auVar76._0_4_;
        auVar179._4_4_ = fVar86 + fVar73 * auVar76._4_4_;
        auVar179._8_4_ = fVar86 + fVar73 * auVar76._8_4_;
        auVar179._12_4_ = fVar86 + fVar73 * auVar76._12_4_;
        auVar205._8_8_ = 0;
        auVar205._0_8_ = *(ulong *)(uVar70 + 0x60 + local_da8);
        auVar76 = vpmovzxbd_avx(auVar205);
        auVar76 = vcvtdq2ps_avx(auVar76);
        fVar88 = *(float *)(uVar70 + 0x7c + local_da8);
        fVar91 = *(float *)(uVar70 + 0x70 + local_da8);
        auVar206._0_4_ = fVar91 + fVar88 * auVar76._0_4_;
        auVar206._4_4_ = fVar91 + fVar88 * auVar76._4_4_;
        auVar206._8_4_ = fVar91 + fVar88 * auVar76._8_4_;
        auVar206._12_4_ = fVar91 + fVar88 * auVar76._12_4_;
        auVar76 = vsubps_avx(auVar206,auVar179);
        auVar180._0_4_ = auVar76._0_4_ * fVar94 + auVar179._0_4_;
        auVar180._4_4_ = auVar76._4_4_ * fVar97 + auVar179._4_4_;
        auVar180._8_4_ = auVar76._8_4_ * fVar100 + auVar179._8_4_;
        auVar180._12_4_ = auVar76._12_4_ * fVar154 + auVar179._12_4_;
        auVar207._8_8_ = 0;
        auVar207._0_8_ = *(ulong *)(uVar70 + 0x34 + local_da8);
        auVar76 = vpmovzxbd_avx(auVar207);
        auVar76 = vcvtdq2ps_avx(auVar76);
        auVar194._0_4_ = fVar86 + auVar76._0_4_ * fVar73;
        auVar194._4_4_ = fVar86 + auVar76._4_4_ * fVar73;
        auVar194._8_4_ = fVar86 + auVar76._8_4_ * fVar73;
        auVar194._12_4_ = fVar86 + auVar76._12_4_ * fVar73;
        auVar198._8_8_ = 0;
        auVar198._0_8_ = *(ulong *)(uVar70 + 100 + local_da8);
        auVar76 = vpmovzxbd_avx(auVar198);
        auVar76 = vcvtdq2ps_avx(auVar76);
        auVar199._0_4_ = fVar91 + fVar88 * auVar76._0_4_;
        auVar199._4_4_ = fVar91 + fVar88 * auVar76._4_4_;
        auVar199._8_4_ = fVar91 + fVar88 * auVar76._8_4_;
        auVar199._12_4_ = fVar91 + fVar88 * auVar76._12_4_;
        auVar76 = vsubps_avx(auVar199,auVar194);
        auVar103._0_4_ = auVar194._0_4_ + auVar76._0_4_ * fVar94;
        auVar103._4_4_ = auVar194._4_4_ + auVar76._4_4_ * fVar97;
        auVar103._8_4_ = auVar194._8_4_ + auVar76._8_4_ * fVar100;
        auVar103._12_4_ = auVar194._12_4_ + auVar76._12_4_ * fVar154;
        auVar76 = vsubps_avx(auVar122,auVar233._0_16_);
        auVar123._0_4_ = auVar264._0_4_ * auVar76._0_4_;
        auVar123._4_4_ = auVar264._4_4_ * auVar76._4_4_;
        auVar123._8_4_ = auVar264._8_4_ * auVar76._8_4_;
        auVar123._12_4_ = auVar264._12_4_ * auVar76._12_4_;
        auVar76 = vsubps_avx(auVar148,auVar253._0_16_);
        auVar149._0_4_ = local_c40._0_4_ * auVar76._0_4_;
        auVar149._4_4_ = local_c40._4_4_ * auVar76._4_4_;
        auVar149._8_4_ = local_c40._8_4_ * auVar76._8_4_;
        auVar149._12_4_ = local_c40._12_4_ * auVar76._12_4_;
        auVar76 = vsubps_avx(auVar139,auVar233._0_16_);
        auVar140._0_4_ = local_c60._0_4_ * auVar76._0_4_;
        auVar140._4_4_ = local_c60._4_4_ * auVar76._4_4_;
        auVar140._8_4_ = local_c60._8_4_ * auVar76._8_4_;
        auVar140._12_4_ = local_c60._12_4_ * auVar76._12_4_;
        auVar76 = vsubps_avx(auVar164,auVar253._0_16_);
        auVar165._0_4_ = local_c70._0_4_ * auVar76._0_4_;
        auVar165._4_4_ = local_c70._4_4_ * auVar76._4_4_;
        auVar165._8_4_ = local_c70._8_4_ * auVar76._8_4_;
        auVar165._12_4_ = local_c70._12_4_ * auVar76._12_4_;
        auVar116 = vpminsd_avx(auVar123,auVar140);
        auVar76 = vpmaxsd_avx(auVar123,auVar140);
        auVar75 = vpminsd_avx(auVar149,auVar165);
        auVar116 = vpmaxsd_avx(auVar116,auVar75);
        auVar75 = vpmaxsd_avx(auVar149,auVar165);
        auVar117 = vsubps_avx(auVar180,auVar255._0_16_);
        auVar166._0_4_ = local_c50._0_4_ * auVar117._0_4_;
        auVar166._4_4_ = local_c50._4_4_ * auVar117._4_4_;
        auVar166._8_4_ = local_c50._8_4_ * auVar117._8_4_;
        auVar166._12_4_ = local_c50._12_4_ * auVar117._12_4_;
        auVar117 = vsubps_avx(auVar103,auVar255._0_16_);
        auVar104._0_4_ = local_c80._0_4_ * auVar117._0_4_;
        auVar104._4_4_ = local_c80._4_4_ * auVar117._4_4_;
        auVar104._8_4_ = local_c80._8_4_ * auVar117._8_4_;
        auVar104._12_4_ = local_c80._12_4_ * auVar117._12_4_;
        auVar117 = vpminsd_avx(auVar76,auVar75);
        auVar75 = vpminsd_avx(auVar166,auVar104);
        auVar76 = vpmaxsd_avx(auVar166,auVar104);
        auVar75 = vpmaxsd_avx(auVar75,local_c90);
        auVar116 = vpmaxsd_avx(auVar116,auVar75);
        auVar76 = vpminsd_avx(auVar76,local_ca0);
        auVar76 = vpminsd_avx(auVar117,auVar76);
        auVar76 = vpcmpgtd_avx(auVar116,auVar76);
        auVar102 = vpmovsxbd_avx(auVar102);
        auVar76 = vpandn_avx(auVar76,auVar102);
        uVar64 = vmovmskps_avx(auVar76);
        if (uVar64 != 0) {
          local_da8 = local_da8 + uVar70;
          local_d88 = (ulong)(uVar64 & 0xff);
          do {
            lVar13 = 0;
            if (local_d88 != 0) {
              for (; (local_d88 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            uVar5 = *(ushort *)(local_da8 + lVar13 * 8);
            uVar6 = *(ushort *)(local_da8 + 2 + lVar13 * 8);
            uVar64 = *(uint *)(local_da8 + 0x88);
            local_e68 = (ulong)uVar64;
            uVar7 = *(uint *)(local_da8 + 4 + lVar13 * 8);
            local_db8 = (ulong)uVar7;
            local_d70 = context->scene;
            pGVar66 = (local_d70->geometries).items[local_e68].ptr;
            local_d78 = *(long *)&pGVar66->field_0x58;
            local_d80 = pGVar66[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                        * local_db8;
            auVar77._8_8_ = 0;
            auVar77._0_4_ = (pGVar66->time_range).lower;
            auVar77._4_4_ = (pGVar66->time_range).upper;
            auVar76 = vshufps_avx(auVar77,auVar77,0);
            auVar126._16_16_ = auVar76;
            auVar126._0_16_ = auVar76;
            auVar80 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar126);
            auVar102 = vshufps_avx(auVar77,auVar77,0x55);
            auVar76 = vsubps_avx(auVar102,auVar76);
            auVar81._16_16_ = auVar76;
            auVar81._0_16_ = auVar76;
            auVar80 = vdivps_avx(auVar80,auVar81);
            fVar73 = pGVar66->fnumTimeSegments;
            auVar21._4_4_ = fVar73 * auVar80._4_4_;
            auVar21._0_4_ = fVar73 * auVar80._0_4_;
            auVar21._8_4_ = fVar73 * auVar80._8_4_;
            auVar21._12_4_ = fVar73 * auVar80._12_4_;
            auVar21._16_4_ = fVar73 * auVar80._16_4_;
            auVar21._20_4_ = fVar73 * auVar80._20_4_;
            auVar21._24_4_ = fVar73 * auVar80._24_4_;
            auVar21._28_4_ = auVar80._28_4_;
            auVar80 = vroundps_avx(auVar21,1);
            auVar76 = vshufps_avx(ZEXT416((uint)(fVar73 + -1.0)),ZEXT416((uint)(fVar73 + -1.0)),0);
            auVar107._16_16_ = auVar76;
            auVar107._0_16_ = auVar76;
            auVar80 = vminps_avx(auVar80,auVar107);
            auVar80 = vmaxps_avx(auVar80,_DAT_01faff00);
            local_aa0 = vsubps_avx(auVar21,auVar80);
            local_ac0 = vcvtps2dq_avx(auVar80);
            local_e6c = uVar5 & 0x7fff;
            local_e70 = uVar6 & 0x7fff;
            uVar8 = *(uint *)(local_d78 + 4 + local_d80);
            uVar58 = (ulong)uVar8;
            uVar67 = (ulong)(uVar8 * local_e70 + *(int *)(local_d78 + local_d80) + local_e6c);
            lVar13 = *(long *)&pGVar66[2].numPrimitives;
            lVar60 = (long)*(int *)(local_ac0 + k * 4) * 0x38;
            lVar9 = *(long *)(lVar13 + 0x10 + lVar60);
            lVar10 = *(long *)(lVar13 + lVar60);
            auVar76 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar67);
            lVar11 = *(long *)(lVar13 + 0x48 + lVar60);
            auVar102 = *(undefined1 (*) [16])(lVar10 + (uVar67 + 1) * lVar9);
            lVar65 = uVar58 + uVar67;
            auVar117 = *(undefined1 (*) [16])(lVar10 + lVar65 * lVar9);
            lVar62 = uVar67 + uVar58 + 1;
            auVar116 = *(undefined1 (*) [16])(lVar10 + lVar62 * lVar9);
            uVar68 = (ulong)(-1 < (short)uVar5);
            lVar59 = uVar67 + uVar68 + 1;
            auVar75 = *(undefined1 (*) [16])(lVar10 + lVar59 * lVar9);
            lVar61 = uVar68 + lVar62;
            uVar68 = 0;
            if (-1 < (short)uVar6) {
              uVar68 = uVar58;
            }
            auVar118 = *(undefined1 (*) [16])(lVar10 + lVar61 * lVar9);
            auVar132 = *(undefined1 (*) [16])(lVar10 + (lVar65 + uVar68) * lVar9);
            auVar133 = *(undefined1 (*) [16])(lVar10 + (lVar62 + uVar68) * lVar9);
            auVar134 = *(undefined1 (*) [16])(lVar10 + lVar9 * (uVar68 + lVar61));
            lVar13 = *(long *)(lVar13 + 0x38 + lVar60);
            fVar73 = *(float *)(local_aa0 + local_e80 * 4);
            auVar135 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar11 * uVar67),auVar76);
            auVar124._0_4_ = fVar73 * auVar135._0_4_ + auVar76._0_4_;
            auVar124._4_4_ = fVar73 * auVar135._4_4_ + auVar76._4_4_;
            auVar124._8_4_ = fVar73 * auVar135._8_4_ + auVar76._8_4_;
            auVar124._12_4_ = fVar73 * auVar135._12_4_ + auVar76._12_4_;
            auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar11 * (uVar67 + 1)),auVar102);
            auVar208._0_4_ = fVar73 * auVar76._0_4_ + auVar102._0_4_;
            auVar208._4_4_ = fVar73 * auVar76._4_4_ + auVar102._4_4_;
            auVar208._8_4_ = fVar73 * auVar76._8_4_ + auVar102._8_4_;
            auVar208._12_4_ = fVar73 * auVar76._12_4_ + auVar102._12_4_;
            auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar11 * lVar65),auVar117);
            auVar78._0_4_ = fVar73 * auVar76._0_4_ + auVar117._0_4_;
            auVar78._4_4_ = fVar73 * auVar76._4_4_ + auVar117._4_4_;
            auVar78._8_4_ = fVar73 * auVar76._8_4_ + auVar117._8_4_;
            auVar78._12_4_ = fVar73 * auVar76._12_4_ + auVar117._12_4_;
            auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar11 * lVar62),auVar116);
            auVar105._0_4_ = fVar73 * auVar76._0_4_ + auVar116._0_4_;
            auVar105._4_4_ = fVar73 * auVar76._4_4_ + auVar116._4_4_;
            auVar105._8_4_ = fVar73 * auVar76._8_4_ + auVar116._8_4_;
            auVar105._12_4_ = fVar73 * auVar76._12_4_ + auVar116._12_4_;
            auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar11 * lVar59),auVar75);
            auVar150._0_4_ = fVar73 * auVar76._0_4_ + auVar75._0_4_;
            auVar150._4_4_ = fVar73 * auVar76._4_4_ + auVar75._4_4_;
            auVar150._8_4_ = fVar73 * auVar76._8_4_ + auVar75._8_4_;
            auVar150._12_4_ = fVar73 * auVar76._12_4_ + auVar75._12_4_;
            auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar11 * lVar61),auVar118);
            auVar167._0_4_ = fVar73 * auVar76._0_4_ + auVar118._0_4_;
            auVar167._4_4_ = fVar73 * auVar76._4_4_ + auVar118._4_4_;
            auVar167._8_4_ = fVar73 * auVar76._8_4_ + auVar118._8_4_;
            auVar167._12_4_ = fVar73 * auVar76._12_4_ + auVar118._12_4_;
            auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar11 * (lVar65 + uVar68)),
                                 auVar132);
            auVar141._0_4_ = auVar132._0_4_ + fVar73 * auVar76._0_4_;
            auVar141._4_4_ = auVar132._4_4_ + fVar73 * auVar76._4_4_;
            auVar141._8_4_ = auVar132._8_4_ + fVar73 * auVar76._8_4_;
            auVar141._12_4_ = auVar132._12_4_ + fVar73 * auVar76._12_4_;
            auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar11 * (lVar62 + uVar68)),
                                 auVar133);
            auVar181._0_4_ = auVar133._0_4_ + fVar73 * auVar76._0_4_;
            auVar181._4_4_ = auVar133._4_4_ + fVar73 * auVar76._4_4_;
            auVar181._8_4_ = auVar133._8_4_ + fVar73 * auVar76._8_4_;
            auVar181._12_4_ = auVar133._12_4_ + fVar73 * auVar76._12_4_;
            auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + (uVar68 + lVar61) * lVar11),
                                 auVar134);
            auVar195._0_4_ = auVar134._0_4_ + fVar73 * auVar76._0_4_;
            auVar195._4_4_ = auVar134._4_4_ + fVar73 * auVar76._4_4_;
            auVar195._8_4_ = auVar134._8_4_ + fVar73 * auVar76._8_4_;
            auVar195._12_4_ = auVar134._12_4_ + fVar73 * auVar76._12_4_;
            auVar116 = vunpcklps_avx(auVar124,auVar105);
            auVar76 = vunpckhps_avx(auVar124,auVar105);
            auVar75 = vunpcklps_avx(auVar208,auVar78);
            auVar102 = vunpckhps_avx(auVar208,auVar78);
            auVar118 = vunpcklps_avx(auVar76,auVar102);
            auVar132 = vunpcklps_avx(auVar116,auVar75);
            auVar76 = vunpckhps_avx(auVar116,auVar75);
            auVar75 = vunpcklps_avx(auVar208,auVar167);
            auVar102 = vunpckhps_avx(auVar208,auVar167);
            auVar117 = vunpcklps_avx(auVar150,auVar105);
            auVar116 = vunpckhps_avx(auVar150,auVar105);
            auVar133 = vunpcklps_avx(auVar102,auVar116);
            auVar134 = vunpcklps_avx(auVar75,auVar117);
            auVar102 = vunpckhps_avx(auVar75,auVar117);
            auVar117 = vunpcklps_avx(auVar105,auVar195);
            auVar116 = vunpckhps_avx(auVar105,auVar195);
            auVar135 = vunpcklps_avx(auVar167,auVar181);
            auVar75 = vunpckhps_avx(auVar167,auVar181);
            auVar136 = vunpcklps_avx(auVar116,auVar75);
            auVar142 = vunpcklps_avx(auVar117,auVar135);
            auVar116 = vunpckhps_avx(auVar117,auVar135);
            auVar135 = vunpcklps_avx(auVar78,auVar181);
            auVar75 = vunpckhps_avx(auVar78,auVar181);
            auVar143 = vunpcklps_avx(auVar105,auVar141);
            auVar117 = vunpckhps_avx(auVar105,auVar141);
            auVar117 = vunpcklps_avx(auVar75,auVar117);
            auVar103 = vunpcklps_avx(auVar135,auVar143);
            auVar75 = vunpckhps_avx(auVar135,auVar143);
            auVar183._16_16_ = auVar142;
            auVar183._0_16_ = auVar132;
            auVar196._16_16_ = auVar116;
            auVar196._0_16_ = auVar76;
            auVar127._16_16_ = auVar136;
            auVar127._0_16_ = auVar118;
            auVar200._16_16_ = auVar134;
            auVar200._0_16_ = auVar134;
            auVar209._16_16_ = auVar102;
            auVar209._0_16_ = auVar102;
            auVar152._16_16_ = auVar133;
            auVar152._0_16_ = auVar133;
            auVar218._16_16_ = auVar103;
            auVar218._0_16_ = auVar103;
            auVar108._16_16_ = auVar75;
            auVar108._0_16_ = auVar75;
            auVar82._16_16_ = auVar117;
            auVar82._0_16_ = auVar117;
            uVar3 = *(undefined4 *)(local_e78 + local_e80 * 4);
            auVar221._4_4_ = uVar3;
            auVar221._0_4_ = uVar3;
            auVar221._8_4_ = uVar3;
            auVar221._12_4_ = uVar3;
            auVar221._16_4_ = uVar3;
            auVar221._20_4_ = uVar3;
            auVar221._24_4_ = uVar3;
            auVar221._28_4_ = uVar3;
            uVar3 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x20);
            auVar232._4_4_ = uVar3;
            auVar232._0_4_ = uVar3;
            auVar232._8_4_ = uVar3;
            auVar232._12_4_ = uVar3;
            auVar232._16_4_ = uVar3;
            auVar232._20_4_ = uVar3;
            auVar232._24_4_ = uVar3;
            auVar232._28_4_ = uVar3;
            uVar3 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x40);
            auVar252._4_4_ = uVar3;
            auVar252._0_4_ = uVar3;
            auVar252._8_4_ = uVar3;
            auVar252._12_4_ = uVar3;
            auVar252._16_4_ = uVar3;
            auVar252._20_4_ = uVar3;
            auVar252._24_4_ = uVar3;
            auVar252._28_4_ = uVar3;
            auVar80 = vsubps_avx(auVar183,auVar221);
            auVar125 = vsubps_avx(auVar196,auVar232);
            auVar81 = vsubps_avx(auVar127,auVar252);
            auVar21 = vsubps_avx(auVar200,auVar221);
            auVar107 = vsubps_avx(auVar209,auVar232);
            auVar126 = vsubps_avx(auVar152,auVar252);
            auVar22 = vsubps_avx(auVar218,auVar221);
            auVar23 = vsubps_avx(auVar108,auVar232);
            auVar24 = vsubps_avx(auVar82,auVar252);
            auVar25 = vsubps_avx(auVar22,auVar80);
            auVar26 = vsubps_avx(auVar23,auVar125);
            auVar82 = vsubps_avx(auVar24,auVar81);
            fVar86 = auVar125._0_4_;
            fVar73 = auVar23._0_4_ + fVar86;
            fVar94 = auVar125._4_4_;
            fVar85 = auVar23._4_4_ + fVar94;
            fVar154 = auVar125._8_4_;
            fVar87 = auVar23._8_4_ + fVar154;
            fVar159 = auVar125._12_4_;
            fVar89 = auVar23._12_4_ + fVar159;
            fVar114 = auVar125._16_4_;
            fVar92 = auVar23._16_4_ + fVar114;
            fVar15 = auVar125._20_4_;
            fVar95 = auVar23._20_4_ + fVar15;
            fVar18 = auVar125._24_4_;
            fVar98 = auVar23._24_4_ + fVar18;
            fVar74 = auVar125._28_4_;
            fVar88 = auVar81._0_4_;
            fVar173 = auVar24._0_4_ + fVar88;
            fVar97 = auVar81._4_4_;
            fVar185 = auVar24._4_4_ + fVar97;
            fVar155 = auVar81._8_4_;
            fVar186 = auVar24._8_4_ + fVar155;
            fVar161 = auVar81._12_4_;
            fVar187 = auVar24._12_4_ + fVar161;
            fVar115 = auVar81._16_4_;
            fVar188 = auVar24._16_4_ + fVar115;
            fVar16 = auVar81._20_4_;
            fVar189 = auVar24._20_4_ + fVar16;
            fVar19 = auVar81._24_4_;
            fVar190 = auVar24._24_4_ + fVar19;
            fVar204 = auVar81._28_4_;
            fVar90 = auVar82._0_4_;
            fVar93 = auVar82._4_4_;
            auVar27._4_4_ = fVar85 * fVar93;
            auVar27._0_4_ = fVar73 * fVar90;
            fVar96 = auVar82._8_4_;
            auVar27._8_4_ = fVar87 * fVar96;
            fVar99 = auVar82._12_4_;
            auVar27._12_4_ = fVar89 * fVar99;
            fVar101 = auVar82._16_4_;
            auVar27._16_4_ = fVar92 * fVar101;
            fVar112 = auVar82._20_4_;
            auVar27._20_4_ = fVar95 * fVar112;
            fVar113 = auVar82._24_4_;
            auVar27._24_4_ = fVar98 * fVar113;
            auVar27._28_4_ = auVar102._12_4_;
            fVar229 = auVar26._0_4_;
            fVar234 = auVar26._4_4_;
            auVar29._4_4_ = fVar234 * fVar185;
            auVar29._0_4_ = fVar229 * fVar173;
            fVar237 = auVar26._8_4_;
            auVar29._8_4_ = fVar237 * fVar186;
            fVar240 = auVar26._12_4_;
            auVar29._12_4_ = fVar240 * fVar187;
            fVar243 = auVar26._16_4_;
            auVar29._16_4_ = fVar243 * fVar188;
            fVar246 = auVar26._20_4_;
            auVar29._20_4_ = fVar246 * fVar189;
            fVar249 = auVar26._24_4_;
            auVar29._24_4_ = fVar249 * fVar190;
            auVar29._28_4_ = auVar103._12_4_;
            auVar26 = vsubps_avx(auVar29,auVar27);
            fVar91 = auVar80._0_4_;
            fVar203 = auVar22._0_4_ + fVar91;
            fVar100 = auVar80._4_4_;
            fVar212 = auVar22._4_4_ + fVar100;
            fVar157 = auVar80._8_4_;
            fVar213 = auVar22._8_4_ + fVar157;
            fVar162 = auVar80._12_4_;
            fVar214 = auVar22._12_4_ + fVar162;
            fVar14 = auVar80._16_4_;
            fVar215 = auVar22._16_4_ + fVar14;
            fVar17 = auVar80._20_4_;
            fVar216 = auVar22._20_4_ + fVar17;
            fVar20 = auVar80._24_4_;
            fVar217 = auVar22._24_4_ + fVar20;
            fVar220 = auVar25._0_4_;
            fVar223 = auVar25._4_4_;
            auVar30._4_4_ = fVar223 * fVar185;
            auVar30._0_4_ = fVar220 * fVar173;
            fVar224 = auVar25._8_4_;
            auVar30._8_4_ = fVar224 * fVar186;
            fVar225 = auVar25._12_4_;
            auVar30._12_4_ = fVar225 * fVar187;
            fVar226 = auVar25._16_4_;
            auVar30._16_4_ = fVar226 * fVar188;
            fVar227 = auVar25._20_4_;
            auVar30._20_4_ = fVar227 * fVar189;
            fVar228 = auVar25._24_4_;
            auVar30._24_4_ = fVar228 * fVar190;
            auVar30._28_4_ = auVar24._28_4_ + fVar204;
            auVar25._4_4_ = fVar212 * fVar93;
            auVar25._0_4_ = fVar203 * fVar90;
            auVar25._8_4_ = fVar213 * fVar96;
            auVar25._12_4_ = fVar214 * fVar99;
            auVar25._16_4_ = fVar215 * fVar101;
            auVar25._20_4_ = fVar216 * fVar112;
            auVar25._24_4_ = fVar217 * fVar113;
            auVar25._28_4_ = auVar103._12_4_;
            auVar25 = vsubps_avx(auVar25,auVar30);
            auVar31._4_4_ = fVar212 * fVar234;
            auVar31._0_4_ = fVar203 * fVar229;
            auVar31._8_4_ = fVar213 * fVar237;
            auVar31._12_4_ = fVar214 * fVar240;
            auVar31._16_4_ = fVar215 * fVar243;
            auVar31._20_4_ = fVar216 * fVar246;
            auVar31._24_4_ = fVar217 * fVar249;
            auVar31._28_4_ = auVar22._28_4_ + auVar80._28_4_;
            auVar32._4_4_ = fVar223 * fVar85;
            auVar32._0_4_ = fVar220 * fVar73;
            auVar32._8_4_ = fVar224 * fVar87;
            auVar32._12_4_ = fVar225 * fVar89;
            auVar32._16_4_ = fVar226 * fVar92;
            auVar32._20_4_ = fVar227 * fVar95;
            auVar32._24_4_ = fVar228 * fVar98;
            auVar32._28_4_ = auVar23._28_4_ + fVar74;
            auVar27 = vsubps_avx(auVar32,auVar31);
            local_e60._4_4_ = *(float *)(local_e78 + local_e80 * 4 + 0xa0);
            fVar73 = *(float *)(local_e78 + local_e80 * 4 + 0xc0);
            fStack_e38 = *(float *)(local_e78 + local_e80 * 4 + 0x80);
            local_b00._0_4_ =
                 auVar26._0_4_ * fStack_e38 +
                 auVar27._0_4_ * fVar73 + local_e60._4_4_ * auVar25._0_4_;
            local_b00._4_4_ =
                 auVar26._4_4_ * fStack_e38 +
                 auVar27._4_4_ * fVar73 + local_e60._4_4_ * auVar25._4_4_;
            local_b00._8_4_ =
                 auVar26._8_4_ * fStack_e38 +
                 auVar27._8_4_ * fVar73 + local_e60._4_4_ * auVar25._8_4_;
            local_b00._12_4_ =
                 auVar26._12_4_ * fStack_e38 +
                 auVar27._12_4_ * fVar73 + local_e60._4_4_ * auVar25._12_4_;
            local_b00._16_4_ =
                 auVar26._16_4_ * fStack_e38 +
                 auVar27._16_4_ * fVar73 + local_e60._4_4_ * auVar25._16_4_;
            local_b00._20_4_ =
                 auVar26._20_4_ * fStack_e38 +
                 auVar27._20_4_ * fVar73 + local_e60._4_4_ * auVar25._20_4_;
            local_b00._24_4_ =
                 auVar26._24_4_ * fStack_e38 +
                 auVar27._24_4_ * fVar73 + local_e60._4_4_ * auVar25._24_4_;
            local_b00._28_4_ = auVar25._28_4_ + auVar27._28_4_ + auVar25._28_4_;
            local_c00 = vsubps_avx(auVar125,auVar107);
            local_ae0 = vsubps_avx(auVar81,auVar126);
            fVar89 = fVar86 + auVar107._0_4_;
            fVar92 = fVar94 + auVar107._4_4_;
            fVar95 = fVar154 + auVar107._8_4_;
            fVar98 = fVar159 + auVar107._12_4_;
            fVar173 = fVar114 + auVar107._16_4_;
            fVar185 = fVar15 + auVar107._20_4_;
            fVar186 = fVar18 + auVar107._24_4_;
            fVar85 = auVar107._28_4_;
            fVar187 = fVar88 + auVar126._0_4_;
            fVar188 = fVar97 + auVar126._4_4_;
            fVar189 = fVar155 + auVar126._8_4_;
            fVar190 = fVar161 + auVar126._12_4_;
            fVar203 = fVar115 + auVar126._16_4_;
            fVar212 = fVar16 + auVar126._20_4_;
            fVar213 = fVar19 + auVar126._24_4_;
            fVar87 = auVar126._28_4_;
            fVar230 = local_ae0._0_4_;
            fVar235 = local_ae0._4_4_;
            auVar26._4_4_ = fVar235 * fVar92;
            auVar26._0_4_ = fVar230 * fVar89;
            fVar238 = local_ae0._8_4_;
            auVar26._8_4_ = fVar238 * fVar95;
            fVar241 = local_ae0._12_4_;
            auVar26._12_4_ = fVar241 * fVar98;
            fVar244 = local_ae0._16_4_;
            auVar26._16_4_ = fVar244 * fVar173;
            fVar247 = local_ae0._20_4_;
            auVar26._20_4_ = fVar247 * fVar185;
            fVar250 = local_ae0._24_4_;
            auVar26._24_4_ = fVar250 * fVar186;
            auVar26._28_4_ = fVar204;
            fVar262 = local_c00._0_4_;
            fVar265 = local_c00._4_4_;
            auVar33._4_4_ = fVar265 * fVar188;
            auVar33._0_4_ = fVar262 * fVar187;
            fVar267 = local_c00._8_4_;
            auVar33._8_4_ = fVar267 * fVar189;
            fVar269 = local_c00._12_4_;
            auVar33._12_4_ = fVar269 * fVar190;
            fVar271 = local_c00._16_4_;
            auVar33._16_4_ = fVar271 * fVar203;
            fVar273 = local_c00._20_4_;
            auVar33._20_4_ = fVar273 * fVar212;
            fVar275 = local_c00._24_4_;
            auVar33._24_4_ = fVar275 * fVar213;
            auVar33._28_4_ = fVar74;
            auVar125 = vsubps_avx(auVar33,auVar26);
            auVar25 = vsubps_avx(auVar80,auVar21);
            fVar254 = auVar25._0_4_;
            fVar256 = auVar25._4_4_;
            auVar34._4_4_ = fVar256 * fVar188;
            auVar34._0_4_ = fVar254 * fVar187;
            fVar257 = auVar25._8_4_;
            auVar34._8_4_ = fVar257 * fVar189;
            fVar258 = auVar25._12_4_;
            auVar34._12_4_ = fVar258 * fVar190;
            fVar259 = auVar25._16_4_;
            auVar34._16_4_ = fVar259 * fVar203;
            fVar260 = auVar25._20_4_;
            auVar34._20_4_ = fVar260 * fVar212;
            fVar261 = auVar25._24_4_;
            auVar34._24_4_ = fVar261 * fVar213;
            auVar34._28_4_ = fVar204 + fVar87;
            fVar204 = fVar91 + auVar21._0_4_;
            fVar187 = fVar100 + auVar21._4_4_;
            fVar188 = fVar157 + auVar21._8_4_;
            fVar189 = fVar162 + auVar21._12_4_;
            fVar190 = fVar14 + auVar21._16_4_;
            fVar203 = fVar17 + auVar21._20_4_;
            fVar212 = fVar20 + auVar21._24_4_;
            auVar35._4_4_ = fVar187 * fVar235;
            auVar35._0_4_ = fVar204 * fVar230;
            auVar35._8_4_ = fVar188 * fVar238;
            auVar35._12_4_ = fVar189 * fVar241;
            auVar35._16_4_ = fVar190 * fVar244;
            auVar35._20_4_ = fVar203 * fVar247;
            auVar35._24_4_ = fVar212 * fVar250;
            auVar35._28_4_ = local_ae0._28_4_;
            auVar25 = vsubps_avx(auVar35,auVar34);
            auVar36._4_4_ = fVar187 * fVar265;
            auVar36._0_4_ = fVar204 * fVar262;
            auVar36._8_4_ = fVar188 * fVar267;
            auVar36._12_4_ = fVar189 * fVar269;
            auVar36._16_4_ = fVar190 * fVar271;
            auVar36._20_4_ = fVar203 * fVar273;
            auVar36._24_4_ = fVar212 * fVar275;
            auVar36._28_4_ = auVar80._28_4_ + auVar21._28_4_;
            auVar37._4_4_ = fVar256 * fVar92;
            auVar37._0_4_ = fVar254 * fVar89;
            auVar37._8_4_ = fVar257 * fVar95;
            auVar37._12_4_ = fVar258 * fVar98;
            auVar37._16_4_ = fVar259 * fVar173;
            auVar37._20_4_ = fVar260 * fVar185;
            auVar37._24_4_ = fVar261 * fVar186;
            auVar37._28_4_ = fVar74 + fVar85;
            auVar80 = vsubps_avx(auVar37,auVar36);
            local_b20._0_4_ =
                 fStack_e38 * auVar125._0_4_ +
                 auVar80._0_4_ * fVar73 + local_e60._4_4_ * auVar25._0_4_;
            local_b20._4_4_ =
                 fStack_e38 * auVar125._4_4_ +
                 auVar80._4_4_ * fVar73 + local_e60._4_4_ * auVar25._4_4_;
            local_b20._8_4_ =
                 fStack_e38 * auVar125._8_4_ +
                 auVar80._8_4_ * fVar73 + local_e60._4_4_ * auVar25._8_4_;
            local_b20._12_4_ =
                 fStack_e38 * auVar125._12_4_ +
                 auVar80._12_4_ * fVar73 + local_e60._4_4_ * auVar25._12_4_;
            local_b20._16_4_ =
                 fStack_e38 * auVar125._16_4_ +
                 auVar80._16_4_ * fVar73 + local_e60._4_4_ * auVar25._16_4_;
            local_b20._20_4_ =
                 fStack_e38 * auVar125._20_4_ +
                 auVar80._20_4_ * fVar73 + local_e60._4_4_ * auVar25._20_4_;
            local_b20._24_4_ =
                 fStack_e38 * auVar125._24_4_ +
                 auVar80._24_4_ * fVar73 + local_e60._4_4_ * auVar25._24_4_;
            local_b20._28_4_ = auVar125._28_4_ + auVar80._28_4_ + auVar25._28_4_;
            auVar25 = vsubps_avx(auVar21,auVar22);
            fVar214 = auVar21._0_4_ + auVar22._0_4_;
            fVar215 = auVar21._4_4_ + auVar22._4_4_;
            fVar216 = auVar21._8_4_ + auVar22._8_4_;
            fVar217 = auVar21._12_4_ + auVar22._12_4_;
            fVar156 = auVar21._16_4_ + auVar22._16_4_;
            fVar158 = auVar21._20_4_ + auVar22._20_4_;
            fVar160 = auVar21._24_4_ + auVar22._24_4_;
            auVar26 = vsubps_avx(auVar107,auVar23);
            fVar187 = auVar107._0_4_ + auVar23._0_4_;
            fVar188 = auVar107._4_4_ + auVar23._4_4_;
            fVar189 = auVar107._8_4_ + auVar23._8_4_;
            fVar190 = auVar107._12_4_ + auVar23._12_4_;
            fVar203 = auVar107._16_4_ + auVar23._16_4_;
            fVar212 = auVar107._20_4_ + auVar23._20_4_;
            fVar213 = auVar107._24_4_ + auVar23._24_4_;
            auVar80 = vsubps_avx(auVar126,auVar24);
            fVar89 = auVar126._0_4_ + auVar24._0_4_;
            fVar92 = auVar126._4_4_ + auVar24._4_4_;
            fVar95 = auVar126._8_4_ + auVar24._8_4_;
            fVar98 = auVar126._12_4_ + auVar24._12_4_;
            fVar173 = auVar126._16_4_ + auVar24._16_4_;
            fVar185 = auVar126._20_4_ + auVar24._20_4_;
            fVar186 = auVar126._24_4_ + auVar24._24_4_;
            fVar263 = auVar80._0_4_;
            fVar266 = auVar80._4_4_;
            auVar38._4_4_ = fVar266 * fVar188;
            auVar38._0_4_ = fVar263 * fVar187;
            fVar268 = auVar80._8_4_;
            auVar38._8_4_ = fVar268 * fVar189;
            fVar270 = auVar80._12_4_;
            auVar38._12_4_ = fVar270 * fVar190;
            fVar272 = auVar80._16_4_;
            auVar38._16_4_ = fVar272 * fVar203;
            fVar274 = auVar80._20_4_;
            auVar38._20_4_ = fVar274 * fVar212;
            fVar276 = auVar80._24_4_;
            auVar38._24_4_ = fVar276 * fVar213;
            auVar38._28_4_ = auVar125._28_4_;
            fVar231 = auVar26._0_4_;
            fVar236 = auVar26._4_4_;
            auVar39._4_4_ = fVar236 * fVar92;
            auVar39._0_4_ = fVar231 * fVar89;
            fVar239 = auVar26._8_4_;
            auVar39._8_4_ = fVar239 * fVar95;
            fVar242 = auVar26._12_4_;
            auVar39._12_4_ = fVar242 * fVar98;
            fVar245 = auVar26._16_4_;
            auVar39._16_4_ = fVar245 * fVar173;
            fVar248 = auVar26._20_4_;
            auVar39._20_4_ = fVar248 * fVar185;
            fVar251 = auVar26._24_4_;
            auVar39._24_4_ = fVar251 * fVar186;
            auVar39._28_4_ = fVar87;
            auVar80 = vsubps_avx(auVar39,auVar38);
            fVar74 = auVar25._0_4_;
            fVar204 = auVar25._4_4_;
            auVar40._4_4_ = fVar204 * fVar92;
            auVar40._0_4_ = fVar74 * fVar89;
            fVar89 = auVar25._8_4_;
            auVar40._8_4_ = fVar89 * fVar95;
            fVar92 = auVar25._12_4_;
            auVar40._12_4_ = fVar92 * fVar98;
            fVar95 = auVar25._16_4_;
            auVar40._16_4_ = fVar95 * fVar173;
            fVar98 = auVar25._20_4_;
            auVar40._20_4_ = fVar98 * fVar185;
            fVar173 = auVar25._24_4_;
            auVar40._24_4_ = fVar173 * fVar186;
            auVar40._28_4_ = fVar87 + auVar24._28_4_;
            auVar24._4_4_ = fVar266 * fVar215;
            auVar24._0_4_ = fVar263 * fVar214;
            auVar24._8_4_ = fVar268 * fVar216;
            auVar24._12_4_ = fVar270 * fVar217;
            auVar24._16_4_ = fVar272 * fVar156;
            auVar24._20_4_ = fVar274 * fVar158;
            auVar24._24_4_ = fVar276 * fVar160;
            auVar24._28_4_ = fVar87;
            auVar125 = vsubps_avx(auVar24,auVar40);
            auVar41._4_4_ = fVar236 * fVar215;
            auVar41._0_4_ = fVar231 * fVar214;
            auVar41._8_4_ = fVar239 * fVar216;
            auVar41._12_4_ = fVar242 * fVar217;
            auVar41._16_4_ = fVar245 * fVar156;
            auVar41._20_4_ = fVar248 * fVar158;
            auVar41._24_4_ = fVar251 * fVar160;
            auVar41._28_4_ = auVar21._28_4_ + auVar22._28_4_;
            auVar22._4_4_ = fVar204 * fVar188;
            auVar22._0_4_ = fVar74 * fVar187;
            auVar22._8_4_ = fVar89 * fVar189;
            auVar22._12_4_ = fVar92 * fVar190;
            auVar22._16_4_ = fVar95 * fVar203;
            auVar22._20_4_ = fVar98 * fVar212;
            auVar22._24_4_ = fVar173 * fVar213;
            auVar22._28_4_ = fVar85 + auVar23._28_4_;
            auVar21 = vsubps_avx(auVar22,auVar41);
            local_e60._0_4_ = local_e60._4_4_;
            fStack_e58 = local_e60._4_4_;
            fStack_e54 = local_e60._4_4_;
            fStack_e50 = local_e60._4_4_;
            fStack_e4c = local_e60._4_4_;
            fStack_e48 = local_e60._4_4_;
            fStack_e44 = local_e60._4_4_;
            auVar109._0_4_ =
                 fStack_e38 * auVar80._0_4_ +
                 auVar21._0_4_ * fVar73 + local_e60._4_4_ * auVar125._0_4_;
            auVar109._4_4_ =
                 fStack_e38 * auVar80._4_4_ +
                 auVar21._4_4_ * fVar73 + local_e60._4_4_ * auVar125._4_4_;
            auVar109._8_4_ =
                 fStack_e38 * auVar80._8_4_ +
                 auVar21._8_4_ * fVar73 + local_e60._4_4_ * auVar125._8_4_;
            auVar109._12_4_ =
                 fStack_e38 * auVar80._12_4_ +
                 auVar21._12_4_ * fVar73 + local_e60._4_4_ * auVar125._12_4_;
            auVar109._16_4_ =
                 fStack_e38 * auVar80._16_4_ +
                 auVar21._16_4_ * fVar73 + local_e60._4_4_ * auVar125._16_4_;
            auVar109._20_4_ =
                 fStack_e38 * auVar80._20_4_ +
                 auVar21._20_4_ * fVar73 + local_e60._4_4_ * auVar125._20_4_;
            auVar109._24_4_ =
                 fStack_e38 * auVar80._24_4_ +
                 auVar21._24_4_ * fVar73 + local_e60._4_4_ * auVar125._24_4_;
            auVar109._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar125._28_4_;
            local_ba0._0_4_ = auVar109._0_4_ + local_b00._0_4_ + local_b20._0_4_;
            local_ba0._4_4_ = auVar109._4_4_ + local_b00._4_4_ + local_b20._4_4_;
            local_ba0._8_4_ = auVar109._8_4_ + local_b00._8_4_ + local_b20._8_4_;
            local_ba0._12_4_ = auVar109._12_4_ + local_b00._12_4_ + local_b20._12_4_;
            local_ba0._16_4_ = auVar109._16_4_ + local_b00._16_4_ + local_b20._16_4_;
            local_ba0._20_4_ = auVar109._20_4_ + local_b00._20_4_ + local_b20._20_4_;
            local_ba0._24_4_ = auVar109._24_4_ + local_b00._24_4_ + local_b20._24_4_;
            local_ba0._28_4_ = auVar109._28_4_ + local_b00._28_4_ + local_b20._28_4_;
            auVar80 = vminps_avx(local_b00,local_b20);
            auVar80 = vminps_avx(auVar80,auVar109);
            auVar210._8_4_ = 0x7fffffff;
            auVar210._0_8_ = 0x7fffffff7fffffff;
            auVar210._12_4_ = 0x7fffffff;
            auVar210._16_4_ = 0x7fffffff;
            auVar210._20_4_ = 0x7fffffff;
            auVar210._24_4_ = 0x7fffffff;
            auVar210._28_4_ = 0x7fffffff;
            local_b80 = vandps_avx(auVar210,local_ba0);
            fVar185 = local_b80._0_4_ * 1.1920929e-07;
            fVar186 = local_b80._4_4_ * 1.1920929e-07;
            auVar23._4_4_ = fVar186;
            auVar23._0_4_ = fVar185;
            fVar187 = local_b80._8_4_ * 1.1920929e-07;
            auVar23._8_4_ = fVar187;
            fVar188 = local_b80._12_4_ * 1.1920929e-07;
            auVar23._12_4_ = fVar188;
            fVar189 = local_b80._16_4_ * 1.1920929e-07;
            auVar23._16_4_ = fVar189;
            fVar190 = local_b80._20_4_ * 1.1920929e-07;
            auVar23._20_4_ = fVar190;
            fVar203 = local_b80._24_4_ * 1.1920929e-07;
            auVar23._24_4_ = fVar203;
            auVar23._28_4_ = 0x34000000;
            auVar168._0_8_ = CONCAT44(fVar186,fVar185) ^ 0x8000000080000000;
            auVar168._8_4_ = -fVar187;
            auVar168._12_4_ = -fVar188;
            auVar168._16_4_ = -fVar189;
            auVar168._20_4_ = -fVar190;
            auVar168._24_4_ = -fVar203;
            auVar168._28_4_ = 0xb4000000;
            auVar80 = vcmpps_avx(auVar80,auVar168,5);
            auVar21 = vmaxps_avx(local_b00,local_b20);
            auVar125 = vmaxps_avx(auVar21,auVar109);
            auVar125 = vcmpps_avx(auVar125,auVar23,2);
            auVar80 = vorps_avx(auVar80,auVar125);
            k = local_e80;
            ray = local_e78;
            if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar80 >> 0x7f,0) != '\0') ||
                  (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar80 >> 0xbf,0) != '\0') ||
                (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar80[0x1f] < '\0') {
              auStack_d58._20_4_ = auVar82._28_4_;
              auVar42._4_4_ = fVar265 * fVar93;
              auVar42._0_4_ = fVar262 * fVar90;
              auVar42._8_4_ = fVar267 * fVar96;
              auVar42._12_4_ = fVar269 * fVar99;
              auVar42._16_4_ = fVar271 * fVar101;
              auVar42._20_4_ = fVar273 * fVar112;
              auVar42._24_4_ = fVar275 * fVar113;
              auVar42._28_4_ = auVar125._28_4_;
              auVar43._4_4_ = fVar235 * fVar234;
              auVar43._0_4_ = fVar230 * fVar229;
              auVar43._8_4_ = fVar238 * fVar237;
              auVar43._12_4_ = fVar241 * fVar240;
              auVar43._16_4_ = fVar244 * fVar243;
              auVar43._20_4_ = fVar247 * fVar246;
              auVar43._24_4_ = fVar250 * fVar249;
              auVar43._28_4_ = 0x34000000;
              auVar107 = vsubps_avx(auVar43,auVar42);
              auVar44._4_4_ = fVar236 * fVar235;
              auVar44._0_4_ = fVar231 * fVar230;
              auVar44._8_4_ = fVar239 * fVar238;
              auVar44._12_4_ = fVar242 * fVar241;
              auVar44._16_4_ = fVar245 * fVar244;
              auVar44._20_4_ = fVar248 * fVar247;
              auVar44._24_4_ = fVar251 * fVar250;
              auVar44._28_4_ = auVar21._28_4_;
              auVar45._4_4_ = fVar265 * fVar266;
              auVar45._0_4_ = fVar262 * fVar263;
              auVar45._8_4_ = fVar267 * fVar268;
              auVar45._12_4_ = fVar269 * fVar270;
              auVar45._16_4_ = fVar271 * fVar272;
              auVar45._20_4_ = fVar273 * fVar274;
              auVar45._24_4_ = fVar275 * fVar276;
              auVar45._28_4_ = fVar87;
              auVar22 = vsubps_avx(auVar45,auVar44);
              auVar125 = vandps_avx(auVar210,auVar42);
              auVar21 = vandps_avx(auVar210,auVar44);
              auVar125 = vcmpps_avx(auVar125,auVar21,1);
              auVar126 = vblendvps_avx(auVar22,auVar107,auVar125);
              auVar46._4_4_ = fVar256 * fVar266;
              auVar46._0_4_ = fVar254 * fVar263;
              auVar46._8_4_ = fVar257 * fVar268;
              auVar46._12_4_ = fVar258 * fVar270;
              auVar46._16_4_ = fVar259 * fVar272;
              auVar46._20_4_ = fVar260 * fVar274;
              auVar46._24_4_ = fVar261 * fVar276;
              auVar46._28_4_ = auVar107._28_4_;
              auVar47._4_4_ = fVar256 * fVar93;
              auVar47._0_4_ = fVar254 * fVar90;
              auVar47._8_4_ = fVar257 * fVar96;
              auVar47._12_4_ = fVar258 * fVar99;
              auVar47._16_4_ = fVar259 * fVar101;
              auVar47._20_4_ = fVar260 * fVar112;
              auVar47._24_4_ = fVar261 * fVar113;
              auVar47._28_4_ = auVar21._28_4_;
              auVar48._4_4_ = fVar223 * fVar235;
              auVar48._0_4_ = fVar220 * fVar230;
              auVar48._8_4_ = fVar224 * fVar238;
              auVar48._12_4_ = fVar225 * fVar241;
              auVar48._16_4_ = fVar226 * fVar244;
              auVar48._20_4_ = fVar227 * fVar247;
              auVar48._24_4_ = fVar228 * fVar250;
              auVar48._28_4_ = fVar85;
              auVar107 = vsubps_avx(auVar47,auVar48);
              auVar49._4_4_ = fVar235 * fVar204;
              auVar49._0_4_ = fVar230 * fVar74;
              auVar49._8_4_ = fVar238 * fVar89;
              auVar49._12_4_ = fVar241 * fVar92;
              auVar49._16_4_ = fVar244 * fVar95;
              auVar49._20_4_ = fVar247 * fVar98;
              auVar49._24_4_ = fVar250 * fVar173;
              auVar49._28_4_ = auVar22._28_4_;
              auVar22 = vsubps_avx(auVar49,auVar46);
              auVar125 = vandps_avx(auVar210,auVar48);
              auVar21 = vandps_avx(auVar210,auVar46);
              auVar21 = vcmpps_avx(auVar125,auVar21,1);
              auVar22 = vblendvps_avx(auVar22,auVar107,auVar21);
              auVar50._4_4_ = fVar265 * fVar204;
              auVar50._0_4_ = fVar262 * fVar74;
              auVar50._8_4_ = fVar267 * fVar89;
              auVar50._12_4_ = fVar269 * fVar92;
              auVar50._16_4_ = fVar271 * fVar95;
              auVar50._20_4_ = fVar273 * fVar98;
              auVar50._24_4_ = fVar275 * fVar173;
              auVar50._28_4_ = auVar25._28_4_;
              auVar51._4_4_ = fVar223 * fVar265;
              auVar51._0_4_ = fVar220 * fVar262;
              auVar51._8_4_ = fVar224 * fVar267;
              auVar51._12_4_ = fVar225 * fVar269;
              auVar51._16_4_ = fVar226 * fVar271;
              auVar51._20_4_ = fVar227 * fVar273;
              auVar51._24_4_ = fVar228 * fVar275;
              auVar51._28_4_ = auVar21._28_4_;
              auVar52._4_4_ = fVar256 * fVar234;
              auVar52._0_4_ = fVar254 * fVar229;
              auVar52._8_4_ = fVar257 * fVar237;
              auVar52._12_4_ = fVar258 * fVar240;
              auVar52._16_4_ = fVar259 * fVar243;
              auVar52._20_4_ = fVar260 * fVar246;
              auVar52._24_4_ = fVar261 * fVar249;
              auVar52._28_4_ = auVar107._28_4_;
              auVar53._4_4_ = fVar256 * fVar236;
              auVar53._0_4_ = fVar254 * fVar231;
              auVar53._8_4_ = fVar257 * fVar239;
              auVar53._12_4_ = fVar258 * fVar242;
              auVar53._16_4_ = fVar259 * fVar245;
              auVar53._20_4_ = fVar260 * fVar248;
              auVar53._24_4_ = fVar261 * fVar251;
              auVar53._28_4_ = auStack_d58._20_4_;
              auVar23 = vsubps_avx(auVar51,auVar52);
              auVar24 = vsubps_avx(auVar53,auVar50);
              auVar21 = vandps_avx(auVar210,auVar52);
              auVar107 = vandps_avx(auVar210,auVar50);
              auVar107 = vcmpps_avx(auVar21,auVar107,1);
              auVar107 = vblendvps_avx(auVar24,auVar23,auVar107);
              auVar76 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
              fVar204 = auVar107._0_4_;
              fVar85 = auVar107._4_4_;
              fVar87 = auVar107._8_4_;
              fVar90 = auVar107._12_4_;
              fVar93 = auVar107._16_4_;
              fVar96 = auVar107._20_4_;
              fVar99 = auVar107._24_4_;
              fVar203 = auVar22._0_4_;
              fVar212 = auVar22._4_4_;
              fVar213 = auVar22._8_4_;
              fVar214 = auVar22._12_4_;
              fVar215 = auVar22._16_4_;
              fVar216 = auVar22._20_4_;
              fVar74 = auVar23._28_4_;
              fVar217 = auVar22._24_4_;
              fVar101 = auVar126._0_4_;
              fVar112 = auVar126._4_4_;
              fVar113 = auVar126._8_4_;
              fVar89 = auVar126._12_4_;
              fVar92 = auVar126._16_4_;
              fVar95 = auVar126._20_4_;
              fVar98 = auVar126._24_4_;
              fVar173 = fVar101 * fStack_e38 + fVar204 * fVar73 + fVar203 * local_e60._4_4_;
              fVar185 = fVar112 * fStack_e38 + fVar85 * fVar73 + fVar212 * local_e60._4_4_;
              fVar186 = fVar113 * fStack_e38 + fVar87 * fVar73 + fVar213 * local_e60._4_4_;
              fVar187 = fVar89 * fStack_e38 + fVar90 * fVar73 + fVar214 * local_e60._4_4_;
              fVar188 = fVar92 * fStack_e38 + fVar93 * fVar73 + fVar215 * local_e60._4_4_;
              fVar189 = fVar95 * fStack_e38 + fVar96 * fVar73 + fVar216 * local_e60._4_4_;
              fVar73 = fVar98 * fStack_e38 + fVar99 * fVar73 + fVar217 * local_e60._4_4_;
              fVar190 = fVar74 + fVar74 + 0.0;
              auVar128._0_4_ = fVar173 + fVar173;
              auVar128._4_4_ = fVar185 + fVar185;
              auVar128._8_4_ = fVar186 + fVar186;
              auVar128._12_4_ = fVar187 + fVar187;
              auVar128._16_4_ = fVar188 + fVar188;
              auVar128._20_4_ = fVar189 + fVar189;
              auVar128._24_4_ = fVar73 + fVar73;
              auVar128._28_4_ = fVar190 + fVar190;
              fVar173 = fVar101 * fVar91 + fVar204 * fVar88 + fVar203 * fVar86;
              fVar185 = fVar112 * fVar100 + fVar85 * fVar97 + fVar212 * fVar94;
              fVar154 = fVar113 * fVar157 + fVar87 * fVar155 + fVar213 * fVar154;
              fVar155 = fVar89 * fVar162 + fVar90 * fVar161 + fVar214 * fVar159;
              fVar157 = fVar92 * fVar14 + fVar93 * fVar115 + fVar215 * fVar114;
              fVar159 = fVar95 * fVar17 + fVar96 * fVar16 + fVar216 * fVar15;
              fVar161 = fVar98 * fVar20 + fVar99 * fVar19 + fVar217 * fVar18;
              fVar162 = auVar21._28_4_ + fVar74 + auVar21._28_4_;
              auVar80 = vrcpps_avx(auVar128);
              fVar73 = auVar80._0_4_;
              fVar86 = auVar80._4_4_;
              auVar54._4_4_ = auVar128._4_4_ * fVar86;
              auVar54._0_4_ = auVar128._0_4_ * fVar73;
              fVar88 = auVar80._8_4_;
              auVar54._8_4_ = auVar128._8_4_ * fVar88;
              fVar91 = auVar80._12_4_;
              auVar54._12_4_ = auVar128._12_4_ * fVar91;
              fVar94 = auVar80._16_4_;
              auVar54._16_4_ = auVar128._16_4_ * fVar94;
              fVar97 = auVar80._20_4_;
              auVar54._20_4_ = auVar128._20_4_ * fVar97;
              fVar100 = auVar80._24_4_;
              auVar54._24_4_ = auVar128._24_4_ * fVar100;
              auVar54._28_4_ = auVar125._28_4_;
              auVar201._8_4_ = 0x3f800000;
              auVar201._0_8_ = 0x3f8000003f800000;
              auVar201._12_4_ = 0x3f800000;
              auVar201._16_4_ = 0x3f800000;
              auVar201._20_4_ = 0x3f800000;
              auVar201._24_4_ = 0x3f800000;
              auVar201._28_4_ = 0x3f800000;
              auVar80 = vsubps_avx(auVar201,auVar54);
              local_9a0._4_4_ = (fVar185 + fVar185) * (fVar86 + fVar86 * auVar80._4_4_);
              local_9a0._0_4_ = (fVar173 + fVar173) * (fVar73 + fVar73 * auVar80._0_4_);
              local_9a0._8_4_ = (fVar154 + fVar154) * (fVar88 + fVar88 * auVar80._8_4_);
              local_9a0._12_4_ = (fVar155 + fVar155) * (fVar91 + fVar91 * auVar80._12_4_);
              local_9a0._16_4_ = (fVar157 + fVar157) * (fVar94 + fVar94 * auVar80._16_4_);
              local_9a0._20_4_ = (fVar159 + fVar159) * (fVar97 + fVar97 * auVar80._20_4_);
              local_9a0._24_4_ = (fVar161 + fVar161) * (fVar100 + fVar100 * auVar80._24_4_);
              local_9a0._28_4_ = fVar162 + fVar162;
              uVar3 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x60);
              auVar169._4_4_ = uVar3;
              auVar169._0_4_ = uVar3;
              auVar169._8_4_ = uVar3;
              auVar169._12_4_ = uVar3;
              auVar169._16_4_ = uVar3;
              auVar169._20_4_ = uVar3;
              auVar169._24_4_ = uVar3;
              auVar169._28_4_ = uVar3;
              auVar80 = vcmpps_avx(auVar169,local_9a0,2);
              uVar3 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x100);
              local_d40._4_4_ = uVar3;
              local_d40._0_4_ = uVar3;
              local_d40._8_4_ = uVar3;
              local_d40._12_4_ = uVar3;
              local_d40._16_4_ = uVar3;
              local_d40._20_4_ = uVar3;
              local_d40._24_4_ = uVar3;
              local_d40._28_4_ = uVar3;
              auVar172 = ZEXT3264(local_d40);
              auVar125 = vcmpps_avx(local_9a0,local_d40,2);
              auVar80 = vandps_avx(auVar125,auVar80);
              auVar102 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
              auVar76 = vpand_avx(auVar102,auVar76);
              auVar102 = vpmovsxwd_avx(auVar76);
              auVar116 = vpshufd_avx(auVar76,0xee);
              auVar116 = vpmovsxwd_avx(auVar116);
              auVar170._16_16_ = auVar116;
              auVar170._0_16_ = auVar102;
              if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar170 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar170 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar170 >> 0x7f,0) != '\0') ||
                    (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar116 >> 0x3f,0) != '\0') ||
                  (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar116[0xf] < '\0') {
                auVar80 = vcmpps_avx(auVar128,_DAT_01faff00,4);
                auVar102 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
                auVar76 = vpand_avx(auVar76,auVar102);
                auVar102 = vpmovsxwd_avx(auVar76);
                auVar116 = vpunpckhwd_avx(auVar76,auVar76);
                local_a00._16_16_ = auVar116;
                local_a00._0_16_ = auVar102;
                if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(local_a00 >> 0x7f,0) != '\0') ||
                      (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB161(auVar116 >> 0x3f,0) != '\0') ||
                    (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar116[0xf] < '\0') {
                  local_a40 = local_ba0;
                  local_a20 = &local_e81;
                  auVar80 = vsubps_avx(local_ba0,local_b20);
                  auVar80 = vblendvps_avx(local_b00,auVar80,local_b40);
                  auVar125 = vsubps_avx(local_ba0,local_b00);
                  auVar125 = vblendvps_avx(local_b20,auVar125,local_b40);
                  local_980[0] = (float)local_b60._0_4_ * fVar101;
                  local_980[1] = (float)local_b60._4_4_ * fVar112;
                  local_980[2] = fStack_b58 * fVar113;
                  local_980[3] = fStack_b54 * fVar89;
                  fStack_970 = fStack_b50 * fVar92;
                  fStack_96c = fStack_b4c * fVar95;
                  fStack_968 = fStack_b48 * fVar98;
                  uStack_964 = auVar126._28_4_;
                  local_960[0] = fVar203 * (float)local_b60._0_4_;
                  local_960[1] = fVar212 * (float)local_b60._4_4_;
                  local_960[2] = fVar213 * fStack_b58;
                  local_960[3] = fVar214 * fStack_b54;
                  fStack_950 = fVar215 * fStack_b50;
                  fStack_94c = fVar216 * fStack_b4c;
                  fStack_948 = fVar217 * fStack_b48;
                  uStack_944 = auVar126._28_4_;
                  local_940[0] = (float)local_b60._0_4_ * fVar204;
                  local_940[1] = (float)local_b60._4_4_ * fVar85;
                  local_940[2] = fStack_b58 * fVar87;
                  local_940[3] = fStack_b54 * fVar90;
                  fStack_930 = fStack_b50 * fVar93;
                  fStack_92c = fStack_b4c * fVar96;
                  fStack_928 = fStack_b48 * fVar99;
                  uStack_924 = auVar107._28_4_;
                  auVar102 = vpshufd_avx(ZEXT416(local_e6c),0);
                  auVar102 = vpaddd_avx(auVar102,_DAT_01fab9b0);
                  auVar151._0_4_ = (float)(int)(*(ushort *)(local_d78 + 8 + local_d80) - 1);
                  auVar151._4_12_ = auVar26._4_12_;
                  auVar116 = vpshufd_avx(ZEXT416(local_e70),0);
                  auVar116 = vpaddd_avx(auVar116,_DAT_01fab9c0);
                  auVar75 = vrcpss_avx(auVar151,auVar151);
                  auVar182._0_4_ = (float)(int)(*(ushort *)(local_d78 + 10 + local_d80) - 1);
                  auVar182._4_12_ = auVar26._4_12_;
                  auVar117 = vrcpss_avx(auVar182,auVar182);
                  auVar83._16_16_ = auVar102;
                  auVar83._0_16_ = auVar102;
                  auVar21 = vcvtdq2ps_avx(auVar83);
                  fVar154 = auVar21._28_4_ + auVar80._28_4_;
                  auVar102 = ZEXT416((uint)(auVar75._0_4_ * (2.0 - auVar75._0_4_ * auVar151._0_4_)))
                  ;
                  auVar102 = vshufps_avx(auVar102,auVar102,0);
                  fVar73 = (local_ba0._0_4_ * auVar21._0_4_ + auVar80._0_4_) * auVar102._0_4_;
                  fVar86 = (local_ba0._4_4_ * auVar21._4_4_ + auVar80._4_4_) * auVar102._4_4_;
                  local_a80._4_4_ = fVar86;
                  local_a80._0_4_ = fVar73;
                  fVar88 = (local_ba0._8_4_ * auVar21._8_4_ + auVar80._8_4_) * auVar102._8_4_;
                  local_a80._8_4_ = fVar88;
                  fVar91 = (local_ba0._12_4_ * auVar21._12_4_ + auVar80._12_4_) * auVar102._12_4_;
                  local_a80._12_4_ = fVar91;
                  fVar94 = (local_ba0._16_4_ * auVar21._16_4_ + auVar80._16_4_) * auVar102._0_4_;
                  local_a80._16_4_ = fVar94;
                  fVar97 = (local_ba0._20_4_ * auVar21._20_4_ + auVar80._20_4_) * auVar102._4_4_;
                  local_a80._20_4_ = fVar97;
                  fVar100 = (local_ba0._24_4_ * auVar21._24_4_ + auVar80._24_4_) * auVar102._8_4_;
                  local_a80._24_4_ = fVar100;
                  local_a80._28_4_ = fVar154;
                  auVar110._16_16_ = auVar116;
                  auVar110._0_16_ = auVar116;
                  auVar80 = vcvtdq2ps_avx(auVar110);
                  auVar102 = ZEXT416((uint)(auVar117._0_4_ * (2.0 - auVar117._0_4_ * auVar182._0_4_)
                                           ));
                  auVar102 = vshufps_avx(auVar102,auVar102,0);
                  fVar155 = (local_ba0._0_4_ * auVar80._0_4_ + auVar125._0_4_) * auVar102._0_4_;
                  fVar157 = (local_ba0._4_4_ * auVar80._4_4_ + auVar125._4_4_) * auVar102._4_4_;
                  local_a60._4_4_ = fVar157;
                  local_a60._0_4_ = fVar155;
                  fVar159 = (local_ba0._8_4_ * auVar80._8_4_ + auVar125._8_4_) * auVar102._8_4_;
                  local_a60._8_4_ = fVar159;
                  fVar161 = (local_ba0._12_4_ * auVar80._12_4_ + auVar125._12_4_) * auVar102._12_4_;
                  local_a60._12_4_ = fVar161;
                  fVar162 = (local_ba0._16_4_ * auVar80._16_4_ + auVar125._16_4_) * auVar102._0_4_;
                  local_a60._16_4_ = fVar162;
                  fVar114 = (local_ba0._20_4_ * auVar80._20_4_ + auVar125._20_4_) * auVar102._4_4_;
                  local_a60._20_4_ = fVar114;
                  fVar115 = (local_ba0._24_4_ * auVar80._24_4_ + auVar125._24_4_) * auVar102._8_4_;
                  local_a60._24_4_ = fVar115;
                  local_a60._28_4_ = auVar80._28_4_ + auVar125._28_4_;
                  pGVar66 = (local_d70->geometries).items[local_e68].ptr;
                  if ((pGVar66->mask & *(uint *)(local_e78 + local_e80 * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar66->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_003c7bb8:
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      return bVar72;
                    }
                    auVar80 = vrcpps_avx(local_ba0);
                    fVar14 = auVar80._0_4_;
                    fVar15 = auVar80._4_4_;
                    auVar55._4_4_ = local_ba0._4_4_ * fVar15;
                    auVar55._0_4_ = local_ba0._0_4_ * fVar14;
                    fVar16 = auVar80._8_4_;
                    auVar55._8_4_ = local_ba0._8_4_ * fVar16;
                    fVar17 = auVar80._12_4_;
                    auVar55._12_4_ = local_ba0._12_4_ * fVar17;
                    fVar18 = auVar80._16_4_;
                    auVar55._16_4_ = local_ba0._16_4_ * fVar18;
                    fVar19 = auVar80._20_4_;
                    auVar55._20_4_ = local_ba0._20_4_ * fVar19;
                    fVar20 = auVar80._24_4_;
                    auVar55._24_4_ = local_ba0._24_4_ * fVar20;
                    auVar55._28_4_ = local_ba0._28_4_;
                    auVar171._8_4_ = 0x3f800000;
                    auVar171._0_8_ = 0x3f8000003f800000;
                    auVar171._12_4_ = 0x3f800000;
                    auVar171._16_4_ = 0x3f800000;
                    auVar171._20_4_ = 0x3f800000;
                    auVar171._24_4_ = 0x3f800000;
                    auVar171._28_4_ = 0x3f800000;
                    auVar125 = vsubps_avx(auVar171,auVar55);
                    auVar129._0_4_ = fVar14 + fVar14 * auVar125._0_4_;
                    auVar129._4_4_ = fVar15 + fVar15 * auVar125._4_4_;
                    auVar129._8_4_ = fVar16 + fVar16 * auVar125._8_4_;
                    auVar129._12_4_ = fVar17 + fVar17 * auVar125._12_4_;
                    auVar129._16_4_ = fVar18 + fVar18 * auVar125._16_4_;
                    auVar129._20_4_ = fVar19 + fVar19 * auVar125._20_4_;
                    auVar129._24_4_ = fVar20 + fVar20 * auVar125._24_4_;
                    auVar129._28_4_ = auVar80._28_4_ + auVar125._28_4_;
                    auVar153._8_4_ = 0x219392ef;
                    auVar153._0_8_ = 0x219392ef219392ef;
                    auVar153._12_4_ = 0x219392ef;
                    auVar153._16_4_ = 0x219392ef;
                    auVar153._20_4_ = 0x219392ef;
                    auVar153._24_4_ = 0x219392ef;
                    auVar153._28_4_ = 0x219392ef;
                    auVar80 = vcmpps_avx(local_b80,auVar153,5);
                    auVar80 = vandps_avx(auVar80,auVar129);
                    auVar56._4_4_ = fVar86 * auVar80._4_4_;
                    auVar56._0_4_ = fVar73 * auVar80._0_4_;
                    auVar56._8_4_ = fVar88 * auVar80._8_4_;
                    auVar56._12_4_ = fVar91 * auVar80._12_4_;
                    auVar56._16_4_ = fVar94 * auVar80._16_4_;
                    auVar56._20_4_ = fVar97 * auVar80._20_4_;
                    auVar56._24_4_ = fVar100 * auVar80._24_4_;
                    auVar56._28_4_ = fVar154;
                    local_9e0 = vminps_avx(auVar56,auVar171);
                    auVar57._4_4_ = fVar157 * auVar80._4_4_;
                    auVar57._0_4_ = fVar155 * auVar80._0_4_;
                    auVar57._8_4_ = fVar159 * auVar80._8_4_;
                    auVar57._12_4_ = fVar161 * auVar80._12_4_;
                    auVar57._16_4_ = fVar162 * auVar80._16_4_;
                    auVar57._20_4_ = fVar114 * auVar80._20_4_;
                    auVar57._24_4_ = fVar115 * auVar80._24_4_;
                    auVar57._28_4_ = local_9e0._28_4_;
                    local_9c0 = vminps_avx(auVar57,auVar171);
                    auVar76 = vpacksswb_avx(auVar76,auVar76);
                    bVar28 = SUB161(auVar76 >> 7,0) & 1 | (SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar76 >> 0x37,0) & 1) << 6 | SUB161(auVar76 >> 0x3f,0) << 7;
                    local_e40 = (ulong)bVar28;
                    uVar68 = 0;
                    if (local_e40 != 0) {
                      for (; (bVar28 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
                      }
                    }
                    if (bVar28 != 0) {
                      auVar76 = vshufps_avx(ZEXT416(uVar64),ZEXT416(uVar64),0);
                      local_e00._16_16_ = auVar76;
                      local_e00._0_16_ = auVar76;
                      auVar76 = vshufps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0);
                      local_ce0._16_16_ = auVar76;
                      local_ce0._0_16_ = auVar76;
                      local_d00 = ZEXT1632(*local_dc0);
                      local_d20 = auVar81._0_16_;
                      uStack_d10 = *(undefined8 *)(local_dc8 + 0x10);
                      uStack_d08 = *(undefined8 *)(local_dc8 + 0x18);
                      uStack_e10 = *(undefined8 *)(local_dc8 + 0x10);
                      local_e20 = *local_dc0;
                      uStack_e08 = *(undefined8 *)(local_dc8 + 0x18);
                      auStack_d58 = auVar82._8_24_;
                      local_d60 = pGVar66;
                      fStack_e34 = fStack_e38;
                      fStack_e30 = fStack_e38;
                      fStack_e2c = fStack_e38;
                      fStack_e28 = fStack_e38;
                      fStack_e24 = fStack_e38;
                      do {
                        local_8c0 = *(undefined4 *)(local_9e0 + uVar68 * 4);
                        local_8a0 = *(undefined4 *)(local_9c0 + uVar68 * 4);
                        *(float *)(ray + k * 4 + 0x100) = local_980[uVar68 - 8];
                        local_920 = local_980[uVar68];
                        local_900 = local_960[uVar68];
                        fVar73 = local_940[uVar68];
                        local_8e0._4_4_ = fVar73;
                        local_8e0._0_4_ = fVar73;
                        local_8e0._8_4_ = fVar73;
                        local_8e0._12_4_ = fVar73;
                        local_8e0._16_4_ = fVar73;
                        local_8e0._20_4_ = fVar73;
                        local_8e0._24_4_ = fVar73;
                        local_8e0._28_4_ = fVar73;
                        local_c30.context = context->user;
                        fStack_91c = local_920;
                        fStack_918 = local_920;
                        fStack_914 = local_920;
                        fStack_910 = local_920;
                        fStack_90c = local_920;
                        fStack_908 = local_920;
                        fStack_904 = local_920;
                        fStack_8fc = local_900;
                        fStack_8f8 = local_900;
                        fStack_8f4 = local_900;
                        fStack_8f0 = local_900;
                        fStack_8ec = local_900;
                        fStack_8e8 = local_900;
                        fStack_8e4 = local_900;
                        uStack_8bc = local_8c0;
                        uStack_8b8 = local_8c0;
                        uStack_8b4 = local_8c0;
                        uStack_8b0 = local_8c0;
                        uStack_8ac = local_8c0;
                        uStack_8a8 = local_8c0;
                        uStack_8a4 = local_8c0;
                        uStack_89c = local_8a0;
                        uStack_898 = local_8a0;
                        uStack_894 = local_8a0;
                        uStack_890 = local_8a0;
                        uStack_88c = local_8a0;
                        uStack_888 = local_8a0;
                        uStack_884 = local_8a0;
                        local_880 = local_ce0._0_8_;
                        uStack_878 = local_ce0._8_8_;
                        uStack_870 = local_ce0._16_8_;
                        uStack_868 = local_ce0._24_8_;
                        local_860 = local_e00._0_8_;
                        uStack_858 = local_e00._8_8_;
                        uStack_850 = local_e00._16_8_;
                        uStack_848 = local_e00._24_8_;
                        auVar80 = vcmpps_avx(local_8e0,local_8e0,0xf);
                        uStack_83c = (local_c30.context)->instID[0];
                        local_840 = uStack_83c;
                        uStack_838 = uStack_83c;
                        uStack_834 = uStack_83c;
                        uStack_830 = uStack_83c;
                        uStack_82c = uStack_83c;
                        uStack_828 = uStack_83c;
                        uStack_824 = uStack_83c;
                        uStack_81c = (local_c30.context)->instPrimID[0];
                        local_820 = uStack_81c;
                        uStack_818 = uStack_81c;
                        uStack_814 = uStack_81c;
                        uStack_810 = uStack_81c;
                        uStack_80c = uStack_81c;
                        uStack_808 = uStack_81c;
                        uStack_804 = uStack_81c;
                        local_cc0 = local_e20._0_8_;
                        uStack_cb8 = local_e20._8_8_;
                        uStack_cb0 = uStack_e10;
                        uStack_ca8 = uStack_e08;
                        local_c30.valid = (int *)&local_cc0;
                        local_c30.geometryUserPtr = pGVar66->userPtr;
                        local_c30.hit = (RTCHitN *)&local_920;
                        local_c30.N = 8;
                        auVar106 = local_d00._0_16_;
                        auVar79 = local_d20;
                        local_c30.ray = (RTCRayN *)ray;
                        if (pGVar66->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          local_e60 = uVar68;
                          auVar80 = ZEXT1632(auVar80._0_16_);
                          (*pGVar66->occlusionFilterN)(&local_c30);
                          auVar172 = ZEXT3264(local_d40);
                          auVar80 = vcmpps_avx(auVar80,auVar80,0xf);
                          auVar106._8_8_ = uStack_cb8;
                          auVar106._0_8_ = local_cc0;
                          auVar79._8_8_ = uStack_ca8;
                          auVar79._0_8_ = uStack_cb0;
                          k = local_e80;
                          pGVar66 = local_d60;
                          ray = local_e78;
                          uVar68 = local_e60;
                        }
                        auVar76 = vpcmpeqd_avx(auVar106,ZEXT816(0) << 0x40);
                        auVar102 = vpcmpeqd_avx(auVar79,ZEXT816(0) << 0x40);
                        auVar130._16_16_ = auVar102;
                        auVar130._0_16_ = auVar76;
                        auVar125 = auVar80 & ~auVar130;
                        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar125 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar125 >> 0x7f,0) == '\0')
                              && (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar125 >> 0xbf,0) == '\0') &&
                            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar125[0x1f]) {
                          auVar84._0_4_ = auVar76._0_4_ ^ auVar80._0_4_;
                          auVar84._4_4_ = auVar76._4_4_ ^ auVar80._4_4_;
                          auVar84._8_4_ = auVar76._8_4_ ^ auVar80._8_4_;
                          auVar84._12_4_ = auVar76._12_4_ ^ auVar80._12_4_;
                          auVar84._16_4_ = auVar102._0_4_ ^ auVar80._16_4_;
                          auVar84._20_4_ = auVar102._4_4_ ^ auVar80._20_4_;
                          auVar84._24_4_ = auVar102._8_4_ ^ auVar80._24_4_;
                          auVar84._28_4_ = auVar102._12_4_ ^ auVar80._28_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar66->field_8).field_0x2 & 0x40) != 0)))) {
                            local_e60 = uVar68;
                            auVar80 = ZEXT1632(auVar80._0_16_);
                            (*p_Var12)(&local_c30);
                            auVar172 = ZEXT3264(local_d40);
                            auVar80 = vcmpps_avx(auVar80,auVar80,0xf);
                            auVar106._8_8_ = uStack_cb8;
                            auVar106._0_8_ = local_cc0;
                            auVar79._8_8_ = uStack_ca8;
                            auVar79._0_8_ = uStack_cb0;
                            k = local_e80;
                            pGVar66 = local_d60;
                            ray = local_e78;
                            uVar68 = local_e60;
                          }
                          auVar76 = vpcmpeqd_avx(auVar106,ZEXT816(0) << 0x40);
                          auVar102 = vpcmpeqd_avx(auVar79,ZEXT816(0) << 0x40);
                          auVar111._16_16_ = auVar102;
                          auVar111._0_16_ = auVar76;
                          auVar84._0_4_ = auVar76._0_4_ ^ auVar80._0_4_;
                          auVar84._4_4_ = auVar76._4_4_ ^ auVar80._4_4_;
                          auVar84._8_4_ = auVar76._8_4_ ^ auVar80._8_4_;
                          auVar84._12_4_ = auVar76._12_4_ ^ auVar80._12_4_;
                          auVar84._16_4_ = auVar102._0_4_ ^ auVar80._16_4_;
                          auVar84._20_4_ = auVar102._4_4_ ^ auVar80._20_4_;
                          auVar84._24_4_ = auVar102._8_4_ ^ auVar80._24_4_;
                          auVar84._28_4_ = auVar102._12_4_ ^ auVar80._28_4_;
                          auVar131._8_4_ = 0xff800000;
                          auVar131._0_8_ = 0xff800000ff800000;
                          auVar131._12_4_ = 0xff800000;
                          auVar131._16_4_ = 0xff800000;
                          auVar131._20_4_ = 0xff800000;
                          auVar131._24_4_ = 0xff800000;
                          auVar131._28_4_ = 0xff800000;
                          auVar80 = vblendvps_avx(auVar131,*(undefined1 (*) [32])
                                                            (local_c30.ray + 0x100),auVar111);
                          *(undefined1 (*) [32])(local_c30.ray + 0x100) = auVar80;
                        }
                        if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar84 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar84 >> 0x7f,0) != '\0') ||
                              (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar84 >> 0xbf,0) != '\0') ||
                            (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar84[0x1f] < '\0') goto LAB_003c7bb8;
                        *(int *)(ray + k * 4 + 0x100) = auVar172._0_4_;
                        local_e40 = local_e40 ^ 1L << (uVar68 & 0x3f);
                        uVar68 = 0;
                        if (local_e40 != 0) {
                          for (; (local_e40 >> uVar68 & 1) == 0; uVar68 = uVar68 + 1) {
                          }
                        }
                      } while (local_e40 != 0);
                    }
                  }
                }
              }
            }
            local_d88 = local_d88 & local_d88 - 1;
            auVar233 = ZEXT1664(local_bb0);
            auVar253 = ZEXT1664(local_bc0);
            auVar255 = ZEXT1664(local_bd0);
            auVar264 = ZEXT1664(local_be0);
            uVar68 = local_db0;
          } while (local_d88 != 0);
        }
        auVar222 = ZEXT1664(local_ca0);
        auVar219 = ZEXT1664(local_c70);
        auVar211 = ZEXT1664(local_c60);
        auVar202 = ZEXT1664(local_c40);
        auVar197 = ZEXT1664(local_c80);
        auVar184 = ZEXT1664(local_c50);
        auVar172 = ZEXT1664(local_c90);
        local_da0 = local_da0 + 1;
      } while (local_da0 != local_d98);
    }
LAB_003c7ba2:
    bVar72 = local_d90 != &local_800;
    if (!bVar72) {
      return bVar72;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }